

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [12];
  int iVar56;
  int iVar57;
  int iVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  byte bVar69;
  byte bVar70;
  ulong uVar71;
  byte bVar72;
  ulong uVar73;
  byte bVar74;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  uint uVar75;
  long lVar76;
  bool bVar77;
  ulong uVar78;
  uint uVar79;
  undefined1 auVar90 [16];
  uint uVar138;
  uint uVar139;
  uint uVar141;
  uint uVar142;
  uint uVar143;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  uint uVar140;
  uint uVar144;
  undefined1 auVar130 [32];
  undefined1 auVar89 [16];
  undefined1 auVar131 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float pp;
  float fVar145;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar166;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar167;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  float fVar207;
  float fVar208;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [64];
  undefined1 auVar248 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  float fVar232;
  float fVar234;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar233;
  float fVar235;
  float fVar237;
  undefined1 auVar230 [16];
  float fVar236;
  float fVar238;
  float fVar239;
  undefined1 auVar231 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined4 uVar242;
  float fVar243;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_920 [16];
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  uint local_8b4;
  uint local_8b0;
  undefined4 local_8ac;
  float local_8a8;
  float local_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  RTCFilterFunctionNArguments local_860;
  undefined1 local_830 [16];
  Primitive *local_820;
  ulong local_818;
  ulong local_810;
  ulong local_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  ulong local_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  RTCHitN local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined4 local_5c0;
  undefined4 uStack_5bc;
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [16];
  undefined8 local_590;
  undefined8 uStack_588;
  undefined1 local_580 [16];
  uint local_570;
  uint uStack_56c;
  uint uStack_568;
  uint uStack_564;
  uint uStack_560;
  uint uStack_55c;
  uint uStack_558;
  uint uStack_554;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar132 [32];
  undefined1 auVar135 [32];
  
  PVar1 = prim[1];
  uVar73 = (ulong)(byte)PVar1;
  fVar208 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar83 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar89 = vsubps_avx(auVar82,*(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  fVar207 = fVar208 * auVar89._0_4_;
  fVar145 = fVar208 * auVar83._0_4_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar73 * 4 + 6);
  auVar96 = vpmovsxbd_avx2(auVar82);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar73 * 5 + 6);
  auVar94 = vpmovsxbd_avx2(auVar84);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar73 * 6 + 6);
  auVar97 = vpmovsxbd_avx2(auVar80);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar73 * 0xb + 6);
  auVar98 = vpmovsxbd_avx2(auVar85);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6);
  auVar103 = vpmovsxbd_avx2(auVar87);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar99 = vcvtdq2ps_avx(auVar103);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + (uint)(byte)PVar1 * 0xc + uVar73 + 6);
  auVar95 = vpmovsxbd_avx2(auVar86);
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar78 = (ulong)(uint)((int)(uVar73 * 9) * 2);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar78 + 6);
  auVar100 = vpmovsxbd_avx2(auVar88);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar78 + uVar73 + 6);
  auVar101 = vpmovsxbd_avx2(auVar81);
  auVar101 = vcvtdq2ps_avx(auVar101);
  uVar71 = (ulong)(uint)((int)(uVar73 * 5) << 2);
  auVar248._8_8_ = 0;
  auVar248._0_8_ = *(ulong *)(prim + uVar71 + 6);
  auVar93 = vpmovsxbd_avx2(auVar248);
  auVar102 = vcvtdq2ps_avx(auVar93);
  auVar113._4_4_ = fVar145;
  auVar113._0_4_ = fVar145;
  auVar113._8_4_ = fVar145;
  auVar113._12_4_ = fVar145;
  auVar113._16_4_ = fVar145;
  auVar113._20_4_ = fVar145;
  auVar113._24_4_ = fVar145;
  auVar113._28_4_ = fVar145;
  auVar115._8_4_ = 1;
  auVar115._0_8_ = 0x100000001;
  auVar115._12_4_ = 1;
  auVar115._16_4_ = 1;
  auVar115._20_4_ = 1;
  auVar115._24_4_ = 1;
  auVar115._28_4_ = 1;
  auVar91 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar105 = ZEXT1632(CONCAT412(fVar208 * auVar83._12_4_,
                                CONCAT48(fVar208 * auVar83._8_4_,
                                         CONCAT44(fVar208 * auVar83._4_4_,fVar145))));
  auVar104 = vpermps_avx2(auVar115,auVar105);
  auVar92 = vpermps_avx512vl(auVar91,auVar105);
  fVar145 = auVar92._0_4_;
  fVar232 = auVar92._4_4_;
  auVar105._4_4_ = fVar232 * auVar97._4_4_;
  auVar105._0_4_ = fVar145 * auVar97._0_4_;
  fVar234 = auVar92._8_4_;
  auVar105._8_4_ = fVar234 * auVar97._8_4_;
  fVar236 = auVar92._12_4_;
  auVar105._12_4_ = fVar236 * auVar97._12_4_;
  fVar243 = auVar92._16_4_;
  auVar105._16_4_ = fVar243 * auVar97._16_4_;
  fVar166 = auVar92._20_4_;
  auVar105._20_4_ = fVar166 * auVar97._20_4_;
  fVar238 = auVar92._24_4_;
  auVar105._24_4_ = fVar238 * auVar97._24_4_;
  auVar105._28_4_ = auVar103._28_4_;
  auVar103._4_4_ = auVar95._4_4_ * fVar232;
  auVar103._0_4_ = auVar95._0_4_ * fVar145;
  auVar103._8_4_ = auVar95._8_4_ * fVar234;
  auVar103._12_4_ = auVar95._12_4_ * fVar236;
  auVar103._16_4_ = auVar95._16_4_ * fVar243;
  auVar103._20_4_ = auVar95._20_4_ * fVar166;
  auVar103._24_4_ = auVar95._24_4_ * fVar238;
  auVar103._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = auVar102._4_4_ * fVar232;
  auVar93._0_4_ = auVar102._0_4_ * fVar145;
  auVar93._8_4_ = auVar102._8_4_ * fVar234;
  auVar93._12_4_ = auVar102._12_4_ * fVar236;
  auVar93._16_4_ = auVar102._16_4_ * fVar243;
  auVar93._20_4_ = auVar102._20_4_ * fVar166;
  auVar93._24_4_ = auVar102._24_4_ * fVar238;
  auVar93._28_4_ = auVar92._28_4_;
  auVar82 = vfmadd231ps_fma(auVar105,auVar104,auVar94);
  auVar84 = vfmadd231ps_fma(auVar103,auVar104,auVar99);
  auVar80 = vfmadd231ps_fma(auVar93,auVar101,auVar104);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar113,auVar96);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar113,auVar98);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar100,auVar113);
  auVar114._4_4_ = fVar207;
  auVar114._0_4_ = fVar207;
  auVar114._8_4_ = fVar207;
  auVar114._12_4_ = fVar207;
  auVar114._16_4_ = fVar207;
  auVar114._20_4_ = fVar207;
  auVar114._24_4_ = fVar207;
  auVar114._28_4_ = fVar207;
  auVar93 = ZEXT1632(CONCAT412(fVar208 * auVar89._12_4_,
                               CONCAT48(fVar208 * auVar89._8_4_,
                                        CONCAT44(fVar208 * auVar89._4_4_,fVar207))));
  auVar103 = vpermps_avx2(auVar115,auVar93);
  auVar93 = vpermps_avx512vl(auVar91,auVar93);
  fVar208 = auVar93._0_4_;
  fVar145 = auVar93._4_4_;
  auVar104._4_4_ = fVar145 * auVar97._4_4_;
  auVar104._0_4_ = fVar208 * auVar97._0_4_;
  fVar232 = auVar93._8_4_;
  auVar104._8_4_ = fVar232 * auVar97._8_4_;
  fVar234 = auVar93._12_4_;
  auVar104._12_4_ = fVar234 * auVar97._12_4_;
  fVar236 = auVar93._16_4_;
  auVar104._16_4_ = fVar236 * auVar97._16_4_;
  fVar243 = auVar93._20_4_;
  auVar104._20_4_ = fVar243 * auVar97._20_4_;
  fVar166 = auVar93._24_4_;
  auVar104._24_4_ = fVar166 * auVar97._24_4_;
  auVar104._28_4_ = 1;
  auVar91._4_4_ = auVar95._4_4_ * fVar145;
  auVar91._0_4_ = auVar95._0_4_ * fVar208;
  auVar91._8_4_ = auVar95._8_4_ * fVar232;
  auVar91._12_4_ = auVar95._12_4_ * fVar234;
  auVar91._16_4_ = auVar95._16_4_ * fVar236;
  auVar91._20_4_ = auVar95._20_4_ * fVar243;
  auVar91._24_4_ = auVar95._24_4_ * fVar166;
  auVar91._28_4_ = auVar97._28_4_;
  auVar95._4_4_ = auVar102._4_4_ * fVar145;
  auVar95._0_4_ = auVar102._0_4_ * fVar208;
  auVar95._8_4_ = auVar102._8_4_ * fVar232;
  auVar95._12_4_ = auVar102._12_4_ * fVar234;
  auVar95._16_4_ = auVar102._16_4_ * fVar236;
  auVar95._20_4_ = auVar102._20_4_ * fVar243;
  auVar95._24_4_ = auVar102._24_4_ * fVar166;
  auVar95._28_4_ = auVar93._28_4_;
  auVar85 = vfmadd231ps_fma(auVar104,auVar103,auVar94);
  auVar87 = vfmadd231ps_fma(auVar91,auVar103,auVar99);
  auVar86 = vfmadd231ps_fma(auVar95,auVar103,auVar101);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar114,auVar96);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar114,auVar98);
  auVar110._8_4_ = 0x7fffffff;
  auVar110._0_8_ = 0x7fffffff7fffffff;
  auVar110._12_4_ = 0x7fffffff;
  auVar110._16_4_ = 0x7fffffff;
  auVar110._20_4_ = 0x7fffffff;
  auVar110._24_4_ = 0x7fffffff;
  auVar110._28_4_ = 0x7fffffff;
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar114,auVar100);
  auVar96 = vandps_avx(ZEXT1632(auVar82),auVar110);
  auVar112._8_4_ = 0x219392ef;
  auVar112._0_8_ = 0x219392ef219392ef;
  auVar112._12_4_ = 0x219392ef;
  auVar112._16_4_ = 0x219392ef;
  auVar112._20_4_ = 0x219392ef;
  auVar112._24_4_ = 0x219392ef;
  auVar112._28_4_ = 0x219392ef;
  uVar78 = vcmpps_avx512vl(auVar96,auVar112,1);
  bVar5 = (bool)((byte)uVar78 & 1);
  auVar92._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar82._0_4_;
  bVar5 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar82._4_4_;
  bVar5 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar82._8_4_;
  bVar5 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar82._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar84),auVar110);
  uVar78 = vcmpps_avx512vl(auVar96,auVar112,1);
  bVar5 = (bool)((byte)uVar78 & 1);
  auVar106._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar84._0_4_;
  bVar5 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar106._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar84._4_4_;
  bVar5 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar106._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar84._8_4_;
  bVar5 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar106._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar84._12_4_;
  auVar106._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar106._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar106._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar106._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar80),auVar110);
  uVar78 = vcmpps_avx512vl(auVar96,auVar112,1);
  bVar5 = (bool)((byte)uVar78 & 1);
  auVar96._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar80._0_4_;
  bVar5 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar80._4_4_;
  bVar5 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar80._8_4_;
  bVar5 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar80._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar94 = vrcp14ps_avx512vl(auVar92);
  auVar111._8_4_ = 0x3f800000;
  auVar111._0_8_ = &DAT_3f8000003f800000;
  auVar111._12_4_ = 0x3f800000;
  auVar111._16_4_ = 0x3f800000;
  auVar111._20_4_ = 0x3f800000;
  auVar111._24_4_ = 0x3f800000;
  auVar111._28_4_ = 0x3f800000;
  auVar82 = vfnmadd213ps_fma(auVar92,auVar94,auVar111);
  auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar106);
  auVar84 = vfnmadd213ps_fma(auVar106,auVar94,auVar111);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar96);
  auVar80 = vfnmadd213ps_fma(auVar96,auVar94,auVar111);
  auVar80 = vfmadd132ps_fma(ZEXT1632(auVar80),auVar94,auVar94);
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 7 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar85));
  auVar100._4_4_ = auVar82._4_4_ * auVar96._4_4_;
  auVar100._0_4_ = auVar82._0_4_ * auVar96._0_4_;
  auVar100._8_4_ = auVar82._8_4_ * auVar96._8_4_;
  auVar100._12_4_ = auVar82._12_4_ * auVar96._12_4_;
  auVar100._16_4_ = auVar96._16_4_ * 0.0;
  auVar100._20_4_ = auVar96._20_4_ * 0.0;
  auVar100._24_4_ = auVar96._24_4_ * 0.0;
  auVar100._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 9 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar85));
  auVar95 = vpbroadcastd_avx512vl();
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar1 * 0x10 + 6));
  auVar109._0_4_ = auVar82._0_4_ * auVar96._0_4_;
  auVar109._4_4_ = auVar82._4_4_ * auVar96._4_4_;
  auVar109._8_4_ = auVar82._8_4_ * auVar96._8_4_;
  auVar109._12_4_ = auVar82._12_4_ * auVar96._12_4_;
  auVar109._16_4_ = auVar96._16_4_ * 0.0;
  auVar109._20_4_ = auVar96._20_4_ * 0.0;
  auVar109._24_4_ = auVar96._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar1 * 0x10 + uVar73 * -2 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar87));
  auVar101._4_4_ = auVar84._4_4_ * auVar96._4_4_;
  auVar101._0_4_ = auVar84._0_4_ * auVar96._0_4_;
  auVar101._8_4_ = auVar84._8_4_ * auVar96._8_4_;
  auVar101._12_4_ = auVar84._12_4_ * auVar96._12_4_;
  auVar101._16_4_ = auVar96._16_4_ * 0.0;
  auVar101._20_4_ = auVar96._20_4_ * 0.0;
  auVar101._24_4_ = auVar96._24_4_ * 0.0;
  auVar101._28_4_ = auVar96._28_4_;
  auVar96 = vcvtdq2ps_avx(auVar94);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar87));
  auVar108._0_4_ = auVar84._0_4_ * auVar96._0_4_;
  auVar108._4_4_ = auVar84._4_4_ * auVar96._4_4_;
  auVar108._8_4_ = auVar84._8_4_ * auVar96._8_4_;
  auVar108._12_4_ = auVar84._12_4_ * auVar96._12_4_;
  auVar108._16_4_ = auVar96._16_4_ * 0.0;
  auVar108._20_4_ = auVar96._20_4_ * 0.0;
  auVar108._24_4_ = auVar96._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 + uVar73 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar86));
  auVar102._4_4_ = auVar96._4_4_ * auVar80._4_4_;
  auVar102._0_4_ = auVar96._0_4_ * auVar80._0_4_;
  auVar102._8_4_ = auVar96._8_4_ * auVar80._8_4_;
  auVar102._12_4_ = auVar96._12_4_ * auVar80._12_4_;
  auVar102._16_4_ = auVar96._16_4_ * 0.0;
  auVar102._20_4_ = auVar96._20_4_ * 0.0;
  auVar102._24_4_ = auVar96._24_4_ * 0.0;
  auVar102._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0x17 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar86));
  auVar107._0_4_ = auVar80._0_4_ * auVar96._0_4_;
  auVar107._4_4_ = auVar80._4_4_ * auVar96._4_4_;
  auVar107._8_4_ = auVar80._8_4_ * auVar96._8_4_;
  auVar107._12_4_ = auVar80._12_4_ * auVar96._12_4_;
  auVar107._16_4_ = auVar96._16_4_ * 0.0;
  auVar107._20_4_ = auVar96._20_4_ * 0.0;
  auVar107._24_4_ = auVar96._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar96 = vpminsd_avx2(auVar100,auVar109);
  auVar94 = vpminsd_avx2(auVar101,auVar108);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94 = vpminsd_avx2(auVar102,auVar107);
  uVar242 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar97._4_4_ = uVar242;
  auVar97._0_4_ = uVar242;
  auVar97._8_4_ = uVar242;
  auVar97._12_4_ = uVar242;
  auVar97._16_4_ = uVar242;
  auVar97._20_4_ = uVar242;
  auVar97._24_4_ = uVar242;
  auVar97._28_4_ = uVar242;
  auVar94 = vmaxps_avx512vl(auVar94,auVar97);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94._8_4_ = 0x3f7ffffa;
  auVar94._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar94._12_4_ = 0x3f7ffffa;
  auVar94._16_4_ = 0x3f7ffffa;
  auVar94._20_4_ = 0x3f7ffffa;
  auVar94._24_4_ = 0x3f7ffffa;
  auVar94._28_4_ = 0x3f7ffffa;
  local_420 = vmulps_avx512vl(auVar96,auVar94);
  auVar96 = vpmaxsd_avx2(auVar100,auVar109);
  auVar94 = vpmaxsd_avx2(auVar101,auVar108);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar94 = vpmaxsd_avx2(auVar102,auVar107);
  uVar242 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar98._4_4_ = uVar242;
  auVar98._0_4_ = uVar242;
  auVar98._8_4_ = uVar242;
  auVar98._12_4_ = uVar242;
  auVar98._16_4_ = uVar242;
  auVar98._20_4_ = uVar242;
  auVar98._24_4_ = uVar242;
  auVar98._28_4_ = uVar242;
  auVar94 = vminps_avx512vl(auVar94,auVar98);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar99._8_4_ = 0x3f800003;
  auVar99._0_8_ = 0x3f8000033f800003;
  auVar99._12_4_ = 0x3f800003;
  auVar99._16_4_ = 0x3f800003;
  auVar99._20_4_ = 0x3f800003;
  auVar99._24_4_ = 0x3f800003;
  auVar99._28_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar99);
  uVar14 = vpcmpgtd_avx512vl(auVar95,_DAT_0205a920);
  uVar13 = vcmpps_avx512vl(local_420,auVar96,2);
  if ((byte)((byte)uVar13 & (byte)uVar14) == 0) {
    return;
  }
  local_810 = (ulong)(byte)((byte)uVar13 & (byte)uVar14);
  local_610 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_820 = prim;
LAB_01d739de:
  lVar76 = 0;
  for (uVar78 = local_810; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
    lVar76 = lVar76 + 1;
  }
  uVar75 = *(uint *)(prim + 2);
  local_808 = (ulong)*(uint *)(prim + lVar76 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar75].ptr;
  lVar76 = *(long *)&pGVar3[1].time_range.upper;
  uVar78 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           local_808 *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar82 = *(undefined1 (*) [16])(lVar76 + (long)pGVar3[1].intersectionFilterN * uVar78);
  auVar84 = *(undefined1 (*) [16])(lVar76 + (long)pGVar3[1].intersectionFilterN * (uVar78 + 1));
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar85 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_880 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  auVar250 = ZEXT3264(local_880);
  local_8a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar251 = ZEXT3264(local_8a0);
  auVar80 = vunpcklps_avx512vl(local_880._0_16_,local_8a0._0_16_);
  local_800 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar249 = ZEXT3264(local_800);
  auVar248 = local_800._0_16_;
  local_790 = vinsertps_avx512f(auVar80,auVar248,0x28);
  auVar89._8_4_ = 0xbeaaaaab;
  auVar89._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar89._12_4_ = 0xbeaaaaab;
  auVar86 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar3[2].intersectionFilterN +
                              uVar78 * (long)pGVar3[2].pointQueryFunc),auVar82,auVar89);
  auVar87 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar3[2].intersectionFilterN +
                             (long)pGVar3[2].pointQueryFunc * (uVar78 + 1)),auVar84,auVar89);
  auVar223._0_4_ = auVar84._0_4_ + auVar82._0_4_ + auVar86._0_4_ + auVar87._0_4_;
  auVar223._4_4_ = auVar84._4_4_ + auVar82._4_4_ + auVar86._4_4_ + auVar87._4_4_;
  auVar223._8_4_ = auVar84._8_4_ + auVar82._8_4_ + auVar86._8_4_ + auVar87._8_4_;
  auVar223._12_4_ = auVar84._12_4_ + auVar82._12_4_ + auVar86._12_4_ + auVar87._12_4_;
  auVar83._8_4_ = 0x3e800000;
  auVar83._0_8_ = 0x3e8000003e800000;
  auVar83._12_4_ = 0x3e800000;
  auVar80 = vmulps_avx512vl(auVar223,auVar83);
  auVar80 = vsubps_avx(auVar80,auVar85);
  auVar80 = vdpps_avx(auVar80,local_790,0x7f);
  fVar208 = *(float *)(ray + k * 4 + 0x30);
  local_7a0 = vdpps_avx(local_790,local_790,0x7f);
  auVar227._4_12_ = ZEXT812(0) << 0x20;
  auVar227._0_4_ = local_7a0._0_4_;
  auVar81 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar227);
  auVar88 = vfnmadd213ss_fma(auVar81,local_7a0,ZEXT416(0x40000000));
  local_400 = auVar80._0_4_ * auVar81._0_4_ * auVar88._0_4_;
  auVar228._4_4_ = local_400;
  auVar228._0_4_ = local_400;
  auVar228._8_4_ = local_400;
  auVar228._12_4_ = local_400;
  fStack_650 = local_400;
  _local_660 = auVar228;
  fStack_64c = local_400;
  fStack_648 = local_400;
  fStack_644 = local_400;
  auVar80 = vfmadd231ps_fma(auVar85,local_790,auVar228);
  auVar80 = vblendps_avx(auVar80,ZEXT816(0) << 0x40,8);
  auVar82 = vsubps_avx(auVar82,auVar80);
  auVar85 = vsubps_avx(auVar87,auVar80);
  auVar87 = vsubps_avx(auVar86,auVar80);
  auVar212 = ZEXT3264(_DAT_02020f20);
  auVar84 = vsubps_avx(auVar84,auVar80);
  local_1e0 = auVar82._0_4_;
  uStack_1dc = local_1e0;
  uStack_1d8 = local_1e0;
  uStack_1d4 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1cc = local_1e0;
  uStack_1c8 = local_1e0;
  uStack_1c4 = local_1e0;
  auVar117._8_4_ = 1;
  auVar117._0_8_ = 0x100000001;
  auVar117._12_4_ = 1;
  auVar117._16_4_ = 1;
  auVar117._20_4_ = 1;
  auVar117._24_4_ = 1;
  auVar117._28_4_ = 1;
  local_6a0 = ZEXT1632(auVar82);
  local_200 = vpermps_avx2(auVar117,local_6a0);
  auVar120._8_4_ = 2;
  auVar120._0_8_ = 0x200000002;
  auVar120._12_4_ = 2;
  auVar120._16_4_ = 2;
  auVar120._20_4_ = 2;
  auVar120._24_4_ = 2;
  auVar120._28_4_ = 2;
  local_220 = vpermps_avx2(auVar120,local_6a0);
  auVar121._8_4_ = 3;
  auVar121._0_8_ = 0x300000003;
  auVar121._12_4_ = 3;
  auVar121._16_4_ = 3;
  auVar121._20_4_ = 3;
  auVar121._24_4_ = 3;
  auVar121._28_4_ = 3;
  local_240 = vpermps_avx2(auVar121,local_6a0);
  local_260 = auVar87._0_4_;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_6e0 = ZEXT1632(auVar87);
  local_280 = vpermps_avx2(auVar117,local_6e0);
  local_2a0 = vpermps_avx2(auVar120,local_6e0);
  local_2c0 = vpermps_avx2(auVar121,local_6e0);
  local_2e0 = auVar85._0_4_;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  local_6c0 = ZEXT1632(auVar85);
  local_300 = vpermps_avx2(auVar117,local_6c0);
  local_320 = vpermps_avx2(auVar120,local_6c0);
  local_340 = vpermps_avx2(auVar121,local_6c0);
  uVar242 = auVar84._0_4_;
  local_360._4_4_ = uVar242;
  local_360._0_4_ = uVar242;
  fStack_358 = (float)uVar242;
  fStack_354 = (float)uVar242;
  fStack_350 = (float)uVar242;
  fStack_34c = (float)uVar242;
  fStack_348 = (float)uVar242;
  register0x0000131c = uVar242;
  auVar222 = ZEXT3264(_local_360);
  _local_700 = ZEXT1632(auVar84);
  _local_380 = vpermps_avx2(auVar117,_local_700);
  _local_3a0 = vpermps_avx2(auVar120,_local_700);
  _local_3c0 = vpermps_avx2(auVar121,_local_700);
  auVar82 = vmulss_avx512f(auVar248,auVar248);
  auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),local_8a0,local_8a0);
  local_4a0 = vfmadd231ps_avx512vl(auVar96,local_880,local_880);
  local_3e0._0_4_ = local_4a0._0_4_;
  local_3e0._4_4_ = local_3e0._0_4_;
  local_3e0._8_4_ = local_3e0._0_4_;
  local_3e0._12_4_ = local_3e0._0_4_;
  local_3e0._16_4_ = local_3e0._0_4_;
  local_3e0._20_4_ = local_3e0._0_4_;
  local_3e0._24_4_ = local_3e0._0_4_;
  local_3e0._28_4_ = local_3e0._0_4_;
  auVar116._8_4_ = 0x7fffffff;
  auVar116._0_8_ = 0x7fffffff7fffffff;
  auVar116._12_4_ = 0x7fffffff;
  auVar116._16_4_ = 0x7fffffff;
  auVar116._20_4_ = 0x7fffffff;
  auVar116._24_4_ = 0x7fffffff;
  auVar116._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_3e0,auVar116);
  local_770 = ZEXT416((uint)local_400);
  local_400 = fVar208 - local_400;
  fStack_3fc = local_400;
  fStack_3f8 = local_400;
  fStack_3f4 = local_400;
  fStack_3f0 = local_400;
  fStack_3ec = local_400;
  fStack_3e8 = local_400;
  fStack_3e4 = local_400;
  local_5f0 = vpbroadcastd_avx512vl();
  local_818 = 0;
  local_708 = 1;
  local_600 = vpbroadcastd_avx512vl();
  auVar82 = vsqrtss_avx(local_7a0,local_7a0);
  local_8a4 = auVar82._0_4_;
  auVar82 = vsqrtss_avx(local_7a0,local_7a0);
  local_8a8 = auVar82._0_4_;
  auVar205 = ZEXT1664(ZEXT816(0x3f80000000000000));
  do {
    local_830 = auVar205._0_16_;
    auVar82 = vmovshdup_avx(local_830);
    auVar83 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    fVar145 = auVar205._0_4_;
    fVar166 = auVar82._0_4_ - fVar145;
    fVar243 = fVar166 * 0.04761905;
    auVar226._4_4_ = fVar145;
    auVar226._0_4_ = fVar145;
    auVar226._8_4_ = fVar145;
    auVar226._12_4_ = fVar145;
    auVar226._16_4_ = fVar145;
    auVar226._20_4_ = fVar145;
    auVar226._24_4_ = fVar145;
    auVar226._28_4_ = fVar145;
    local_7c0._4_4_ = fVar166;
    local_7c0._0_4_ = fVar166;
    local_7c0._8_4_ = fVar166;
    local_7c0._12_4_ = fVar166;
    local_7c0._16_4_ = fVar166;
    local_7c0._20_4_ = fVar166;
    local_7c0._24_4_ = fVar166;
    local_7c0._28_4_ = fVar166;
    auVar82 = vfmadd231ps_fma(auVar226,local_7c0,auVar212._0_32_);
    auVar154._8_4_ = 0x3f800000;
    auVar154._0_8_ = &DAT_3f8000003f800000;
    auVar154._12_4_ = 0x3f800000;
    auVar154._16_4_ = 0x3f800000;
    auVar154._20_4_ = 0x3f800000;
    auVar154._24_4_ = 0x3f800000;
    auVar154._28_4_ = 0x3f800000;
    auVar96 = vsubps_avx(auVar154,ZEXT1632(auVar82));
    auVar67._4_4_ = fStack_25c;
    auVar67._0_4_ = local_260;
    auVar67._8_4_ = fStack_258;
    auVar67._12_4_ = fStack_254;
    auVar67._16_4_ = fStack_250;
    auVar67._20_4_ = fStack_24c;
    auVar67._24_4_ = fStack_248;
    auVar67._28_4_ = fStack_244;
    fVar145 = auVar82._0_4_;
    auVar180._0_4_ = local_260 * fVar145;
    fVar232 = auVar82._4_4_;
    auVar180._4_4_ = fStack_25c * fVar232;
    fVar234 = auVar82._8_4_;
    auVar180._8_4_ = fStack_258 * fVar234;
    fVar236 = auVar82._12_4_;
    auVar180._12_4_ = fStack_254 * fVar236;
    auVar180._16_4_ = fStack_250 * 0.0;
    auVar180._20_4_ = fStack_24c * 0.0;
    auVar180._24_4_ = fStack_248 * 0.0;
    auVar180._28_4_ = 0;
    auVar206._0_4_ = local_280._0_4_ * fVar145;
    auVar206._4_4_ = local_280._4_4_ * fVar232;
    auVar206._8_4_ = local_280._8_4_ * fVar234;
    auVar206._12_4_ = local_280._12_4_ * fVar236;
    auVar206._16_4_ = local_280._16_4_ * 0.0;
    auVar206._20_4_ = local_280._20_4_ * 0.0;
    auVar206._28_36_ = auVar205._28_36_;
    auVar206._24_4_ = local_280._24_4_ * 0.0;
    auVar205._0_4_ = local_2a0._0_4_ * fVar145;
    auVar205._4_4_ = local_2a0._4_4_ * fVar232;
    auVar205._8_4_ = local_2a0._8_4_ * fVar234;
    auVar205._12_4_ = local_2a0._12_4_ * fVar236;
    auVar205._16_4_ = local_2a0._16_4_ * 0.0;
    auVar205._20_4_ = local_2a0._20_4_ * 0.0;
    auVar205._28_36_ = auVar212._28_36_;
    auVar205._24_4_ = local_2a0._24_4_ * 0.0;
    auVar212._0_4_ = local_2c0._0_4_ * fVar145;
    auVar212._4_4_ = local_2c0._4_4_ * fVar232;
    auVar212._8_4_ = local_2c0._8_4_ * fVar234;
    auVar212._12_4_ = local_2c0._12_4_ * fVar236;
    auVar212._16_4_ = local_2c0._16_4_ * 0.0;
    auVar212._20_4_ = local_2c0._20_4_ * 0.0;
    auVar212._28_36_ = auVar222._28_36_;
    auVar212._24_4_ = local_2c0._24_4_ * 0.0;
    auVar68._4_4_ = uStack_1dc;
    auVar68._0_4_ = local_1e0;
    auVar68._8_4_ = uStack_1d8;
    auVar68._12_4_ = uStack_1d4;
    auVar68._16_4_ = uStack_1d0;
    auVar68._20_4_ = uStack_1cc;
    auVar68._24_4_ = uStack_1c8;
    auVar68._28_4_ = uStack_1c4;
    auVar84 = vfmadd231ps_fma(auVar180,auVar96,auVar68);
    auVar80 = vfmadd231ps_fma(auVar206._0_32_,auVar96,local_200);
    auVar85 = vfmadd231ps_fma(auVar205._0_32_,auVar96,local_220);
    auVar87 = vfmadd231ps_fma(auVar212._0_32_,auVar96,local_240);
    auVar66._4_4_ = uStack_2dc;
    auVar66._0_4_ = local_2e0;
    auVar66._8_4_ = uStack_2d8;
    auVar66._12_4_ = uStack_2d4;
    auVar66._16_4_ = uStack_2d0;
    auVar66._20_4_ = uStack_2cc;
    auVar66._24_4_ = uStack_2c8;
    auVar66._28_4_ = uStack_2c4;
    auVar94 = vmulps_avx512vl(auVar66,ZEXT1632(auVar82));
    auVar102 = ZEXT1632(auVar82);
    auVar97 = vmulps_avx512vl(local_300,auVar102);
    auVar98 = vmulps_avx512vl(local_320,auVar102);
    auVar99 = vmulps_avx512vl(local_340,auVar102);
    auVar86 = vfmadd231ps_fma(auVar94,auVar96,auVar67);
    auVar88 = vfmadd231ps_fma(auVar97,auVar96,local_280);
    auVar81 = vfmadd231ps_fma(auVar98,auVar96,local_2a0);
    auVar248 = vfmadd231ps_fma(auVar99,auVar96,local_2c0);
    auVar37._4_4_ = fVar232 * (float)local_360._4_4_;
    auVar37._0_4_ = fVar145 * (float)local_360._0_4_;
    auVar37._8_4_ = fVar234 * fStack_358;
    auVar37._12_4_ = fVar236 * fStack_354;
    auVar37._16_4_ = fStack_350 * 0.0;
    auVar37._20_4_ = fStack_34c * 0.0;
    auVar37._24_4_ = fStack_348 * 0.0;
    auVar37._28_4_ = fStack_244;
    auVar38._4_4_ = fVar232 * (float)local_380._4_4_;
    auVar38._0_4_ = fVar145 * (float)local_380._0_4_;
    auVar38._8_4_ = fVar234 * fStack_378;
    auVar38._12_4_ = fVar236 * fStack_374;
    auVar38._16_4_ = fStack_370 * 0.0;
    auVar38._20_4_ = fStack_36c * 0.0;
    auVar38._24_4_ = fStack_368 * 0.0;
    auVar38._28_4_ = local_280._28_4_;
    auVar39._4_4_ = fVar232 * (float)local_3a0._4_4_;
    auVar39._0_4_ = fVar145 * (float)local_3a0._0_4_;
    auVar39._8_4_ = fVar234 * fStack_398;
    auVar39._12_4_ = fVar236 * fStack_394;
    auVar39._16_4_ = fStack_390 * 0.0;
    auVar39._20_4_ = fStack_38c * 0.0;
    auVar39._24_4_ = fStack_388 * 0.0;
    auVar39._28_4_ = local_2a0._28_4_;
    auVar40._4_4_ = fVar232 * (float)local_3c0._4_4_;
    auVar40._0_4_ = fVar145 * (float)local_3c0._0_4_;
    auVar40._8_4_ = fVar234 * fStack_3b8;
    auVar40._12_4_ = fVar236 * fStack_3b4;
    auVar40._16_4_ = fStack_3b0 * 0.0;
    auVar40._20_4_ = fStack_3ac * 0.0;
    auVar40._24_4_ = fStack_3a8 * 0.0;
    auVar40._28_4_ = local_2c0._28_4_;
    auVar94 = vfmadd231ps_avx512vl(auVar37,auVar96,auVar66);
    auVar97 = vfmadd231ps_avx512vl(auVar38,auVar96,local_300);
    auVar98 = vfmadd231ps_avx512vl(auVar39,auVar96,local_320);
    auVar99 = vfmadd231ps_avx512vl(auVar40,auVar96,local_340);
    auVar95 = vmulps_avx512vl(auVar102,ZEXT1632(auVar86));
    auVar100 = vmulps_avx512vl(auVar102,ZEXT1632(auVar88));
    auVar101 = vmulps_avx512vl(auVar102,ZEXT1632(auVar81));
    auVar102 = vmulps_avx512vl(auVar102,ZEXT1632(auVar248));
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar96,ZEXT1632(auVar84));
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,ZEXT1632(auVar80));
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,ZEXT1632(auVar85));
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar96,ZEXT1632(auVar87));
    auVar181._0_4_ = auVar94._0_4_ * fVar145;
    auVar181._4_4_ = auVar94._4_4_ * fVar232;
    auVar181._8_4_ = auVar94._8_4_ * fVar234;
    auVar181._12_4_ = auVar94._12_4_ * fVar236;
    auVar181._16_4_ = auVar94._16_4_ * 0.0;
    auVar181._20_4_ = auVar94._20_4_ * 0.0;
    auVar181._24_4_ = auVar94._24_4_ * 0.0;
    auVar181._28_4_ = 0;
    auVar41._4_4_ = auVar97._4_4_ * fVar232;
    auVar41._0_4_ = auVar97._0_4_ * fVar145;
    auVar41._8_4_ = auVar97._8_4_ * fVar234;
    auVar41._12_4_ = auVar97._12_4_ * fVar236;
    auVar41._16_4_ = auVar97._16_4_ * 0.0;
    auVar41._20_4_ = auVar97._20_4_ * 0.0;
    auVar41._24_4_ = auVar97._24_4_ * 0.0;
    auVar41._28_4_ = auVar94._28_4_;
    auVar42._4_4_ = auVar98._4_4_ * fVar232;
    auVar42._0_4_ = auVar98._0_4_ * fVar145;
    auVar42._8_4_ = auVar98._8_4_ * fVar234;
    auVar42._12_4_ = auVar98._12_4_ * fVar236;
    auVar42._16_4_ = auVar98._16_4_ * 0.0;
    auVar42._20_4_ = auVar98._20_4_ * 0.0;
    auVar42._24_4_ = auVar98._24_4_ * 0.0;
    auVar42._28_4_ = auVar97._28_4_;
    auVar43._4_4_ = auVar99._4_4_ * fVar232;
    auVar43._0_4_ = auVar99._0_4_ * fVar145;
    auVar43._8_4_ = auVar99._8_4_ * fVar234;
    auVar43._12_4_ = auVar99._12_4_ * fVar236;
    auVar43._16_4_ = auVar99._16_4_ * 0.0;
    auVar43._20_4_ = auVar99._20_4_ * 0.0;
    auVar43._24_4_ = auVar99._24_4_ * 0.0;
    auVar43._28_4_ = auVar98._28_4_;
    auVar84 = vfmadd231ps_fma(auVar181,auVar96,ZEXT1632(auVar86));
    auVar80 = vfmadd231ps_fma(auVar41,auVar96,ZEXT1632(auVar88));
    auVar85 = vfmadd231ps_fma(auVar42,auVar96,ZEXT1632(auVar81));
    auVar87 = vfmadd231ps_fma(auVar43,auVar96,ZEXT1632(auVar248));
    auVar94 = vmulps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar85));
    auVar99 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar236 * auVar84._12_4_,
                                            CONCAT48(fVar234 * auVar84._8_4_,
                                                     CONCAT44(fVar232 * auVar84._4_4_,
                                                              fVar145 * auVar84._0_4_)))),auVar96,
                         auVar95);
    auVar222 = ZEXT3264(auVar99);
    auVar103 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar80._12_4_ * fVar236,
                                             CONCAT48(auVar80._8_4_ * fVar234,
                                                      CONCAT44(auVar80._4_4_ * fVar232,
                                                               auVar80._0_4_ * fVar145)))),auVar96,
                          auVar100);
    auVar93 = vfmadd231ps_avx512vl(auVar94,auVar96,auVar101);
    auVar97 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar87._12_4_ * fVar236,
                                            CONCAT48(auVar87._8_4_ * fVar234,
                                                     CONCAT44(auVar87._4_4_ * fVar232,
                                                              auVar87._0_4_ * fVar145)))),auVar102,
                         auVar96);
    auVar96 = vsubps_avx512vl(ZEXT1632(auVar84),auVar95);
    auVar94 = vsubps_avx512vl(ZEXT1632(auVar80),auVar100);
    auVar98 = vsubps_avx512vl(ZEXT1632(auVar85),auVar101);
    auVar95 = vsubps_avx512vl(ZEXT1632(auVar87),auVar102);
    auVar244._0_4_ = fVar243 * auVar96._0_4_ * 3.0;
    auVar244._4_4_ = fVar243 * auVar96._4_4_ * 3.0;
    auVar244._8_4_ = fVar243 * auVar96._8_4_ * 3.0;
    auVar244._12_4_ = fVar243 * auVar96._12_4_ * 3.0;
    auVar244._16_4_ = fVar243 * auVar96._16_4_ * 3.0;
    auVar244._20_4_ = fVar243 * auVar96._20_4_ * 3.0;
    auVar244._24_4_ = fVar243 * auVar96._24_4_ * 3.0;
    auVar244._28_4_ = 0;
    auVar246._0_4_ = fVar243 * auVar94._0_4_ * 3.0;
    auVar246._4_4_ = fVar243 * auVar94._4_4_ * 3.0;
    auVar246._8_4_ = fVar243 * auVar94._8_4_ * 3.0;
    auVar246._12_4_ = fVar243 * auVar94._12_4_ * 3.0;
    auVar246._16_4_ = fVar243 * auVar94._16_4_ * 3.0;
    auVar246._20_4_ = fVar243 * auVar94._20_4_ * 3.0;
    auVar246._24_4_ = fVar243 * auVar94._24_4_ * 3.0;
    auVar246._28_4_ = 0;
    auVar247._0_4_ = auVar98._0_4_ * 3.0 * fVar243;
    auVar247._4_4_ = auVar98._4_4_ * 3.0 * fVar243;
    auVar247._8_4_ = auVar98._8_4_ * 3.0 * fVar243;
    auVar247._12_4_ = auVar98._12_4_ * 3.0 * fVar243;
    auVar247._16_4_ = auVar98._16_4_ * 3.0 * fVar243;
    auVar247._20_4_ = auVar98._20_4_ * 3.0 * fVar243;
    auVar247._24_4_ = auVar98._24_4_ * 3.0 * fVar243;
    auVar247._28_4_ = 0;
    fVar145 = auVar95._0_4_ * 3.0 * fVar243;
    fVar232 = auVar95._4_4_ * 3.0 * fVar243;
    auVar44._4_4_ = fVar232;
    auVar44._0_4_ = fVar145;
    fVar234 = auVar95._8_4_ * 3.0 * fVar243;
    auVar44._8_4_ = fVar234;
    fVar236 = auVar95._12_4_ * 3.0 * fVar243;
    auVar44._12_4_ = fVar236;
    fVar238 = auVar95._16_4_ * 3.0 * fVar243;
    auVar44._16_4_ = fVar238;
    fVar207 = auVar95._20_4_ * 3.0 * fVar243;
    auVar44._20_4_ = fVar207;
    fVar239 = auVar95._24_4_ * 3.0 * fVar243;
    auVar44._24_4_ = fVar239;
    auVar44._28_4_ = fVar243;
    auVar95 = vpermt2ps_avx512vl(auVar99,_DAT_0205fd20,ZEXT1632(auVar83));
    auVar100 = vpermt2ps_avx512vl(auVar103,_DAT_0205fd20,ZEXT1632(auVar83));
    auVar98 = ZEXT1632(auVar83);
    auVar101 = vpermt2ps_avx512vl(auVar93,_DAT_0205fd20,auVar98);
    auVar182._0_4_ = auVar97._0_4_ + fVar145;
    auVar182._4_4_ = auVar97._4_4_ + fVar232;
    auVar182._8_4_ = auVar97._8_4_ + fVar234;
    auVar182._12_4_ = auVar97._12_4_ + fVar236;
    auVar182._16_4_ = auVar97._16_4_ + fVar238;
    auVar182._20_4_ = auVar97._20_4_ + fVar207;
    auVar182._24_4_ = auVar97._24_4_ + fVar239;
    auVar182._28_4_ = auVar97._28_4_ + fVar243;
    auVar96 = vmaxps_avx(auVar97,auVar182);
    auVar94 = vminps_avx(auVar97,auVar182);
    auVar102 = vpermt2ps_avx512vl(auVar97,_DAT_0205fd20,auVar98);
    auVar104 = vpermt2ps_avx512vl(auVar244,_DAT_0205fd20,auVar98);
    auVar105 = vpermt2ps_avx512vl(auVar246,_DAT_0205fd20,auVar98);
    auVar116 = ZEXT1632(auVar83);
    auVar91 = vpermt2ps_avx512vl(auVar247,_DAT_0205fd20,auVar116);
    auVar97 = vpermt2ps_avx512vl(auVar44,_DAT_0205fd20,auVar116);
    auVar92 = vsubps_avx512vl(auVar102,auVar97);
    auVar97 = vsubps_avx(auVar95,auVar99);
    auVar98 = vsubps_avx(auVar100,auVar103);
    auVar106 = vsubps_avx512vl(auVar101,auVar93);
    auVar107 = vmulps_avx512vl(auVar98,auVar247);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar246,auVar106);
    auVar108 = vmulps_avx512vl(auVar106,auVar244);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar247,auVar97);
    auVar109 = vmulps_avx512vl(auVar97,auVar246);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar244,auVar98);
    auVar109 = vmulps_avx512vl(auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar108 = vmulps_avx512vl(auVar106,auVar106);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar98,auVar98);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar97,auVar97);
    auVar109 = vrcp14ps_avx512vl(auVar108);
    auVar110 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar154);
    auVar109 = vfmadd132ps_avx512vl(auVar110,auVar109,auVar109);
    auVar107 = vmulps_avx512vl(auVar107,auVar109);
    auVar110 = vmulps_avx512vl(auVar98,auVar91);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar105,auVar106);
    auVar111 = vmulps_avx512vl(auVar106,auVar104);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar91,auVar97);
    auVar112 = vmulps_avx512vl(auVar97,auVar105);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar104,auVar98);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vmulps_avx512vl(auVar110,auVar109);
    auVar107 = vmaxps_avx512vl(auVar107,auVar109);
    auVar107 = vsqrtps_avx512vl(auVar107);
    auVar109 = vmaxps_avx512vl(auVar92,auVar102);
    auVar96 = vmaxps_avx512vl(auVar96,auVar109);
    auVar109 = vaddps_avx512vl(auVar107,auVar96);
    auVar96 = vminps_avx512vl(auVar92,auVar102);
    auVar96 = vminps_avx(auVar94,auVar96);
    auVar96 = vsubps_avx512vl(auVar96,auVar107);
    auVar122._8_4_ = 0x3f800002;
    auVar122._0_8_ = 0x3f8000023f800002;
    auVar122._12_4_ = 0x3f800002;
    auVar122._16_4_ = 0x3f800002;
    auVar122._20_4_ = 0x3f800002;
    auVar122._24_4_ = 0x3f800002;
    auVar122._28_4_ = 0x3f800002;
    auVar94 = vmulps_avx512vl(auVar109,auVar122);
    auVar123._8_4_ = 0x3f7ffffc;
    auVar123._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar123._12_4_ = 0x3f7ffffc;
    auVar123._16_4_ = 0x3f7ffffc;
    auVar123._20_4_ = 0x3f7ffffc;
    auVar123._24_4_ = 0x3f7ffffc;
    auVar123._28_4_ = 0x3f7ffffc;
    local_7e0 = vmulps_avx512vl(auVar96,auVar123);
    auVar45._4_4_ = auVar94._4_4_ * auVar94._4_4_;
    auVar45._0_4_ = auVar94._0_4_ * auVar94._0_4_;
    auVar45._8_4_ = auVar94._8_4_ * auVar94._8_4_;
    auVar45._12_4_ = auVar94._12_4_ * auVar94._12_4_;
    auVar45._16_4_ = auVar94._16_4_ * auVar94._16_4_;
    auVar45._20_4_ = auVar94._20_4_ * auVar94._20_4_;
    auVar45._24_4_ = auVar94._24_4_ * auVar94._24_4_;
    auVar45._28_4_ = local_7e0._28_4_;
    auVar96 = vrsqrt14ps_avx512vl(auVar108);
    auVar23._8_4_ = 0xbf000000;
    auVar23._0_8_ = 0xbf000000bf000000;
    auVar23._12_4_ = 0xbf000000;
    auVar23._16_4_ = 0xbf000000;
    auVar23._20_4_ = 0xbf000000;
    auVar23._24_4_ = 0xbf000000;
    auVar23._28_4_ = 0xbf000000;
    auVar94 = vmulps_avx512vl(auVar108,auVar23);
    auVar46._4_4_ = auVar96._4_4_ * auVar94._4_4_;
    auVar46._0_4_ = auVar96._0_4_ * auVar94._0_4_;
    auVar46._8_4_ = auVar96._8_4_ * auVar94._8_4_;
    auVar46._12_4_ = auVar96._12_4_ * auVar94._12_4_;
    auVar46._16_4_ = auVar96._16_4_ * auVar94._16_4_;
    auVar46._20_4_ = auVar96._20_4_ * auVar94._20_4_;
    auVar46._24_4_ = auVar96._24_4_ * auVar94._24_4_;
    auVar46._28_4_ = auVar94._28_4_;
    auVar94 = vmulps_avx512vl(auVar96,auVar96);
    auVar94 = vmulps_avx512vl(auVar94,auVar46);
    auVar24._8_4_ = 0x3fc00000;
    auVar24._0_8_ = 0x3fc000003fc00000;
    auVar24._12_4_ = 0x3fc00000;
    auVar24._16_4_ = 0x3fc00000;
    auVar24._20_4_ = 0x3fc00000;
    auVar24._24_4_ = 0x3fc00000;
    auVar24._28_4_ = 0x3fc00000;
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar96,auVar24);
    auVar47._4_4_ = auVar94._4_4_ * auVar97._4_4_;
    auVar47._0_4_ = auVar94._0_4_ * auVar97._0_4_;
    auVar47._8_4_ = auVar94._8_4_ * auVar97._8_4_;
    auVar47._12_4_ = auVar94._12_4_ * auVar97._12_4_;
    auVar47._16_4_ = auVar94._16_4_ * auVar97._16_4_;
    auVar47._20_4_ = auVar94._20_4_ * auVar97._20_4_;
    auVar47._24_4_ = auVar94._24_4_ * auVar97._24_4_;
    auVar47._28_4_ = auVar96._28_4_;
    auVar96 = vmulps_avx512vl(auVar98,auVar94);
    auVar102 = vmulps_avx512vl(auVar106,auVar94);
    auVar92 = vsubps_avx512vl(auVar116,auVar99);
    auVar107 = vsubps_avx512vl(auVar116,auVar103);
    auVar108 = vsubps_avx512vl(auVar116,auVar93);
    auVar109 = vmulps_avx512vl(auVar249._0_32_,auVar108);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar251._0_32_,auVar107);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar250._0_32_,auVar92);
    auVar110 = vmulps_avx512vl(auVar108,auVar108);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar107,auVar107);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar92,auVar92);
    auVar111 = vmulps_avx512vl(auVar249._0_32_,auVar102);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar96,auVar251._0_32_);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar47,auVar250._0_32_);
    auVar102 = vmulps_avx512vl(auVar108,auVar102);
    auVar96 = vfmadd231ps_avx512vl(auVar102,auVar107,auVar96);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar47);
    local_640 = vmulps_avx512vl(auVar111,auVar111);
    auVar102 = vsubps_avx512vl(local_3e0,local_640);
    auVar112 = vmulps_avx512vl(auVar111,auVar96);
    auVar109 = vsubps_avx512vl(auVar109,auVar112);
    auVar109 = vaddps_avx512vl(auVar109,auVar109);
    auVar112 = vmulps_avx512vl(auVar96,auVar96);
    auVar110 = vsubps_avx512vl(auVar110,auVar112);
    auVar112 = vsubps_avx512vl(auVar110,auVar45);
    auVar113 = vmulps_avx512vl(auVar109,auVar109);
    auVar25._8_4_ = 0x40800000;
    auVar25._0_8_ = 0x4080000040800000;
    auVar25._12_4_ = 0x40800000;
    auVar25._16_4_ = 0x40800000;
    auVar25._20_4_ = 0x40800000;
    auVar25._24_4_ = 0x40800000;
    auVar25._28_4_ = 0x40800000;
    auVar114 = vmulps_avx512vl(auVar102,auVar25);
    auVar115 = vmulps_avx512vl(auVar114,auVar112);
    auVar115 = vsubps_avx512vl(auVar113,auVar115);
    auVar82 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
    uVar78 = vcmpps_avx512vl(auVar115,auVar116,5);
    bVar69 = (byte)uVar78;
    if (bVar69 == 0) {
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar115 = vsqrtps_avx512vl(auVar115);
      auVar116 = vaddps_avx512vl(auVar102,auVar102);
      auVar117 = vrcp14ps_avx512vl(auVar116);
      auVar116 = vfnmadd213ps_avx512vl(auVar116,auVar117,auVar154);
      auVar116 = vfmadd132ps_avx512vl(auVar116,auVar117,auVar117);
      auVar26._8_4_ = 0x80000000;
      auVar26._0_8_ = 0x8000000080000000;
      auVar26._12_4_ = 0x80000000;
      auVar26._16_4_ = 0x80000000;
      auVar26._20_4_ = 0x80000000;
      auVar26._24_4_ = 0x80000000;
      auVar26._28_4_ = 0x80000000;
      auVar117 = vxorps_avx512vl(auVar109,auVar26);
      auVar117 = vsubps_avx512vl(auVar117,auVar115);
      auVar117 = vmulps_avx512vl(auVar117,auVar116);
      auVar115 = vsubps_avx512vl(auVar115,auVar109);
      auVar115 = vmulps_avx512vl(auVar115,auVar116);
      auVar116 = vfmadd213ps_avx512vl(auVar111,auVar117,auVar96);
      local_4e0 = vmulps_avx512vl(auVar94,auVar116);
      auVar116 = vfmadd213ps_avx512vl(auVar111,auVar115,auVar96);
      local_500 = vmulps_avx512vl(auVar94,auVar116);
      auVar155._8_4_ = 0x7f800000;
      auVar155._0_8_ = 0x7f8000007f800000;
      auVar155._12_4_ = 0x7f800000;
      auVar155._16_4_ = 0x7f800000;
      auVar155._20_4_ = 0x7f800000;
      auVar155._24_4_ = 0x7f800000;
      auVar155._28_4_ = 0x7f800000;
      auVar116 = vblendmps_avx512vl(auVar155,auVar117);
      auVar118._0_4_ =
           (uint)(bVar69 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar69 & 1) * local_500._0_4_;
      bVar5 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar5 * auVar116._4_4_ | (uint)!bVar5 * local_500._4_4_;
      bVar5 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar5 * auVar116._8_4_ | (uint)!bVar5 * local_500._8_4_;
      bVar5 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar5 * auVar116._12_4_ | (uint)!bVar5 * local_500._12_4_;
      bVar5 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar118._16_4_ = (uint)bVar5 * auVar116._16_4_ | (uint)!bVar5 * local_500._16_4_;
      bVar5 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar118._20_4_ = (uint)bVar5 * auVar116._20_4_ | (uint)!bVar5 * local_500._20_4_;
      bVar5 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar118._24_4_ = (uint)bVar5 * auVar116._24_4_ | (uint)!bVar5 * local_500._24_4_;
      bVar5 = SUB81(uVar78 >> 7,0);
      auVar118._28_4_ = (uint)bVar5 * auVar116._28_4_ | (uint)!bVar5 * local_500._28_4_;
      auVar156._8_4_ = 0xff800000;
      auVar156._0_8_ = 0xff800000ff800000;
      auVar156._12_4_ = 0xff800000;
      auVar156._16_4_ = 0xff800000;
      auVar156._20_4_ = 0xff800000;
      auVar156._24_4_ = 0xff800000;
      auVar156._28_4_ = 0xff800000;
      auVar116 = vblendmps_avx512vl(auVar156,auVar115);
      auVar119._0_4_ =
           (uint)(bVar69 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar115._0_4_;
      bVar5 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar5 * auVar116._4_4_ | (uint)!bVar5 * auVar115._4_4_;
      bVar5 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar5 * auVar116._8_4_ | (uint)!bVar5 * auVar115._8_4_;
      bVar5 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar5 * auVar116._12_4_ | (uint)!bVar5 * auVar115._12_4_;
      bVar5 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar119._16_4_ = (uint)bVar5 * auVar116._16_4_ | (uint)!bVar5 * auVar115._16_4_;
      bVar5 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar119._20_4_ = (uint)bVar5 * auVar116._20_4_ | (uint)!bVar5 * auVar115._20_4_;
      bVar5 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar119._24_4_ = (uint)bVar5 * auVar116._24_4_ | (uint)!bVar5 * auVar115._24_4_;
      bVar5 = SUB81(uVar78 >> 7,0);
      auVar119._28_4_ = (uint)bVar5 * auVar116._28_4_ | (uint)!bVar5 * auVar115._28_4_;
      auVar157._8_4_ = 0x7fffffff;
      auVar157._0_8_ = 0x7fffffff7fffffff;
      auVar157._12_4_ = 0x7fffffff;
      auVar157._16_4_ = 0x7fffffff;
      auVar157._20_4_ = 0x7fffffff;
      auVar157._24_4_ = 0x7fffffff;
      auVar157._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_640,auVar157);
      auVar115 = vmaxps_avx512vl(local_4a0,local_640);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      auVar116 = vmulps_avx512vl(auVar115,auVar27);
      auVar115 = vandps_avx(auVar102,auVar157);
      uVar71 = vcmpps_avx512vl(auVar115,auVar116,1);
      uVar78 = uVar78 & uVar71;
      bVar74 = (byte)uVar78;
      if (bVar74 != 0) {
        uVar71 = vcmpps_avx512vl(auVar112,ZEXT1632(auVar82),2);
        auVar188._8_4_ = 0xff800000;
        auVar188._0_8_ = 0xff800000ff800000;
        auVar188._12_4_ = 0xff800000;
        auVar188._16_4_ = 0xff800000;
        auVar188._20_4_ = 0xff800000;
        auVar188._24_4_ = 0xff800000;
        auVar188._28_4_ = 0xff800000;
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar116 = vblendmps_avx512vl(auVar112,auVar188);
        bVar72 = (byte)uVar71;
        uVar79 = (uint)(bVar72 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar115._0_4_;
        bVar5 = (bool)((byte)(uVar71 >> 1) & 1);
        uVar138 = (uint)bVar5 * auVar116._4_4_ | (uint)!bVar5 * auVar115._4_4_;
        bVar5 = (bool)((byte)(uVar71 >> 2) & 1);
        uVar139 = (uint)bVar5 * auVar116._8_4_ | (uint)!bVar5 * auVar115._8_4_;
        bVar5 = (bool)((byte)(uVar71 >> 3) & 1);
        uVar140 = (uint)bVar5 * auVar116._12_4_ | (uint)!bVar5 * auVar115._12_4_;
        bVar5 = (bool)((byte)(uVar71 >> 4) & 1);
        uVar141 = (uint)bVar5 * auVar116._16_4_ | (uint)!bVar5 * auVar115._16_4_;
        bVar5 = (bool)((byte)(uVar71 >> 5) & 1);
        uVar142 = (uint)bVar5 * auVar116._20_4_ | (uint)!bVar5 * auVar115._20_4_;
        bVar5 = (bool)((byte)(uVar71 >> 6) & 1);
        uVar143 = (uint)bVar5 * auVar116._24_4_ | (uint)!bVar5 * auVar115._24_4_;
        bVar5 = SUB81(uVar71 >> 7,0);
        uVar144 = (uint)bVar5 * auVar116._28_4_ | (uint)!bVar5 * auVar115._28_4_;
        auVar118._0_4_ = (bVar74 & 1) * uVar79 | !(bool)(bVar74 & 1) * auVar118._0_4_;
        bVar5 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar118._4_4_ = bVar5 * uVar138 | !bVar5 * auVar118._4_4_;
        bVar5 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar118._8_4_ = bVar5 * uVar139 | !bVar5 * auVar118._8_4_;
        bVar5 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar118._12_4_ = bVar5 * uVar140 | !bVar5 * auVar118._12_4_;
        bVar5 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar118._16_4_ = bVar5 * uVar141 | !bVar5 * auVar118._16_4_;
        bVar5 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar118._20_4_ = bVar5 * uVar142 | !bVar5 * auVar118._20_4_;
        bVar5 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar118._24_4_ = bVar5 * uVar143 | !bVar5 * auVar118._24_4_;
        bVar5 = SUB81(uVar78 >> 7,0);
        auVar118._28_4_ = bVar5 * uVar144 | !bVar5 * auVar118._28_4_;
        auVar112 = vblendmps_avx512vl(auVar188,auVar112);
        bVar5 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar71 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar71 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar71 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar71 >> 6) & 1);
        bVar11 = SUB81(uVar71 >> 7,0);
        auVar119._0_4_ =
             (uint)(bVar74 & 1) *
             ((uint)(bVar72 & 1) * auVar112._0_4_ | !(bool)(bVar72 & 1) * uVar79) |
             !(bool)(bVar74 & 1) * auVar119._0_4_;
        bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar119._4_4_ =
             (uint)bVar77 * ((uint)bVar5 * auVar112._4_4_ | !bVar5 * uVar138) |
             !bVar77 * auVar119._4_4_;
        bVar5 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar119._8_4_ =
             (uint)bVar5 * ((uint)bVar6 * auVar112._8_4_ | !bVar6 * uVar139) |
             !bVar5 * auVar119._8_4_;
        bVar5 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar119._12_4_ =
             (uint)bVar5 * ((uint)bVar7 * auVar112._12_4_ | !bVar7 * uVar140) |
             !bVar5 * auVar119._12_4_;
        bVar5 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar119._16_4_ =
             (uint)bVar5 * ((uint)bVar8 * auVar112._16_4_ | !bVar8 * uVar141) |
             !bVar5 * auVar119._16_4_;
        bVar5 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar119._20_4_ =
             (uint)bVar5 * ((uint)bVar9 * auVar112._20_4_ | !bVar9 * uVar142) |
             !bVar5 * auVar119._20_4_;
        bVar5 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar119._24_4_ =
             (uint)bVar5 * ((uint)bVar10 * auVar112._24_4_ | !bVar10 * uVar143) |
             !bVar5 * auVar119._24_4_;
        bVar5 = SUB81(uVar78 >> 7,0);
        auVar119._28_4_ =
             (uint)bVar5 * ((uint)bVar11 * auVar112._28_4_ | !bVar11 * uVar144) |
             !bVar5 * auVar119._28_4_;
        bVar69 = (~bVar74 | bVar72) & bVar69;
      }
      auVar154._8_4_ = 0x3f800000;
      auVar154._0_8_ = &DAT_3f8000003f800000;
      auVar154._12_4_ = 0x3f800000;
      auVar154._16_4_ = 0x3f800000;
      auVar154._20_4_ = 0x3f800000;
      auVar154._24_4_ = 0x3f800000;
      auVar154._28_4_ = 0x3f800000;
    }
    in_ZMM31 = ZEXT3264(auVar119);
    if ((bVar69 & 0x7f) == 0) {
      auVar212 = ZEXT3264(_DAT_02020f20);
      auVar250 = ZEXT3264(local_880);
      auVar251 = ZEXT3264(local_8a0);
      auVar249 = ZEXT3264(local_800);
    }
    else {
      fVar145 = *(float *)(ray + k * 4 + 0x80) - (float)local_770._0_4_;
      auVar158._4_4_ = fVar145;
      auVar158._0_4_ = fVar145;
      auVar158._8_4_ = fVar145;
      auVar158._12_4_ = fVar145;
      auVar158._16_4_ = fVar145;
      auVar158._20_4_ = fVar145;
      auVar158._24_4_ = fVar145;
      auVar158._28_4_ = fVar145;
      auVar112 = vminps_avx512vl(auVar158,auVar119);
      auVar65._4_4_ = fStack_3fc;
      auVar65._0_4_ = local_400;
      auVar65._8_4_ = fStack_3f8;
      auVar65._12_4_ = fStack_3f4;
      auVar65._16_4_ = fStack_3f0;
      auVar65._20_4_ = fStack_3ec;
      auVar65._24_4_ = fStack_3e8;
      auVar65._28_4_ = fStack_3e4;
      auVar115 = vmaxps_avx512vl(auVar65,auVar118);
      auVar108 = vmulps_avx512vl(auVar108,auVar247);
      auVar107 = vfmadd213ps_avx512vl(auVar107,auVar246,auVar108);
      auVar92 = vfmadd213ps_avx512vl(auVar92,auVar244,auVar107);
      auVar249 = ZEXT3264(local_800);
      auVar107 = vmulps_avx512vl(local_800,auVar247);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_8a0,auVar246);
      in_ZMM31 = ZEXT3264(local_880);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_880,auVar244);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar107,auVar108);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar13 = vcmpps_avx512vl(auVar108,auVar116,1);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar92 = vxorps_avx512vl(auVar92,auVar117);
      auVar120 = vrcp14ps_avx512vl(auVar107);
      auVar121 = vxorps_avx512vl(auVar107,auVar117);
      auVar122 = vfnmadd213ps_avx512vl(auVar120,auVar107,auVar154);
      auVar122 = vfmadd132ps_avx512vl(auVar122,auVar120,auVar120);
      auVar122 = vmulps_avx512vl(auVar122,auVar92);
      uVar14 = vcmpps_avx512vl(auVar107,auVar121,1);
      bVar74 = (byte)uVar13 | (byte)uVar14;
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar92 = vblendmps_avx512vl(auVar122,auVar123);
      auVar124._0_4_ =
           (uint)(bVar74 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar120._0_4_;
      bVar5 = (bool)(bVar74 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar5 * auVar92._4_4_ | (uint)!bVar5 * auVar120._4_4_;
      bVar5 = (bool)(bVar74 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar5 * auVar92._8_4_ | (uint)!bVar5 * auVar120._8_4_;
      bVar5 = (bool)(bVar74 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar5 * auVar92._12_4_ | (uint)!bVar5 * auVar120._12_4_;
      bVar5 = (bool)(bVar74 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar5 * auVar92._16_4_ | (uint)!bVar5 * auVar120._16_4_;
      bVar5 = (bool)(bVar74 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar5 * auVar92._20_4_ | (uint)!bVar5 * auVar120._20_4_;
      bVar5 = (bool)(bVar74 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar5 * auVar92._24_4_ | (uint)!bVar5 * auVar120._24_4_;
      auVar124._28_4_ =
           (uint)(bVar74 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar120._28_4_;
      auVar92 = vmaxps_avx(auVar115,auVar124);
      uVar14 = vcmpps_avx512vl(auVar107,auVar121,6);
      bVar74 = (byte)uVar13 | (byte)uVar14;
      auVar125._0_4_ = (uint)(bVar74 & 1) * 0x7f800000 | (uint)!(bool)(bVar74 & 1) * auVar122._0_4_;
      bVar5 = (bool)(bVar74 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * auVar122._4_4_;
      bVar5 = (bool)(bVar74 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * auVar122._8_4_;
      bVar5 = (bool)(bVar74 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * auVar122._12_4_;
      bVar5 = (bool)(bVar74 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * auVar122._16_4_;
      bVar5 = (bool)(bVar74 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * auVar122._20_4_;
      bVar5 = (bool)(bVar74 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * auVar122._24_4_;
      auVar125._28_4_ =
           (uint)(bVar74 >> 7) * 0x7f800000 | (uint)!(bool)(bVar74 >> 7) * auVar122._28_4_;
      auVar107 = vminps_avx(auVar112,auVar125);
      auVar82 = vxorps_avx512vl(auVar121._0_16_,auVar121._0_16_);
      auVar95 = vsubps_avx512vl(ZEXT1632(auVar82),auVar95);
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar82),auVar100);
      auVar112 = ZEXT1632(auVar82);
      auVar101 = vsubps_avx512vl(auVar112,auVar101);
      auVar48._4_4_ = auVar101._4_4_ * auVar91._4_4_;
      auVar48._0_4_ = auVar101._0_4_ * auVar91._0_4_;
      auVar48._8_4_ = auVar101._8_4_ * auVar91._8_4_;
      auVar48._12_4_ = auVar101._12_4_ * auVar91._12_4_;
      auVar48._16_4_ = auVar101._16_4_ * auVar91._16_4_;
      auVar48._20_4_ = auVar101._20_4_ * auVar91._20_4_;
      auVar48._24_4_ = auVar101._24_4_ * auVar91._24_4_;
      auVar48._28_4_ = auVar101._28_4_;
      auVar100 = vfnmsub231ps_avx512vl(auVar48,auVar105,auVar100);
      auVar95 = vfnmadd231ps_avx512vl(auVar100,auVar104,auVar95);
      auVar100 = vmulps_avx512vl(local_800,auVar91);
      auVar100 = vfnmsub231ps_avx512vl(auVar100,local_8a0,auVar105);
      auVar100 = vfnmadd231ps_avx512vl(auVar100,local_880,auVar104);
      vandps_avx512vl(auVar100,auVar108);
      uVar13 = vcmpps_avx512vl(auVar100,auVar116,1);
      auVar95 = vxorps_avx512vl(auVar95,auVar117);
      auVar101 = vrcp14ps_avx512vl(auVar100);
      auVar104 = vxorps_avx512vl(auVar100,auVar117);
      auVar91 = vfnmadd213ps_avx512vl(auVar101,auVar100,auVar154);
      auVar82 = vfmadd132ps_fma(auVar91,auVar101,auVar101);
      fVar145 = auVar82._0_4_ * auVar95._0_4_;
      fVar232 = auVar82._4_4_ * auVar95._4_4_;
      auVar49._4_4_ = fVar232;
      auVar49._0_4_ = fVar145;
      fVar234 = auVar82._8_4_ * auVar95._8_4_;
      auVar49._8_4_ = fVar234;
      fVar236 = auVar82._12_4_ * auVar95._12_4_;
      auVar49._12_4_ = fVar236;
      fVar243 = auVar95._16_4_ * 0.0;
      auVar49._16_4_ = fVar243;
      fVar238 = auVar95._20_4_ * 0.0;
      auVar49._20_4_ = fVar238;
      fVar207 = auVar95._24_4_ * 0.0;
      auVar49._24_4_ = fVar207;
      auVar49._28_4_ = auVar95._28_4_;
      uVar14 = vcmpps_avx512vl(auVar100,auVar104,1);
      bVar74 = (byte)uVar13 | (byte)uVar14;
      auVar91 = vblendmps_avx512vl(auVar49,auVar123);
      auVar126._0_4_ =
           (uint)(bVar74 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar101._0_4_;
      bVar5 = (bool)(bVar74 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar5 * auVar91._4_4_ | (uint)!bVar5 * auVar101._4_4_;
      bVar5 = (bool)(bVar74 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar5 * auVar91._8_4_ | (uint)!bVar5 * auVar101._8_4_;
      bVar5 = (bool)(bVar74 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar5 * auVar91._12_4_ | (uint)!bVar5 * auVar101._12_4_;
      bVar5 = (bool)(bVar74 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar5 * auVar91._16_4_ | (uint)!bVar5 * auVar101._16_4_;
      bVar5 = (bool)(bVar74 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar5 * auVar91._20_4_ | (uint)!bVar5 * auVar101._20_4_;
      bVar5 = (bool)(bVar74 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar5 * auVar91._24_4_ | (uint)!bVar5 * auVar101._24_4_;
      auVar126._28_4_ =
           (uint)(bVar74 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar101._28_4_;
      _local_680 = vmaxps_avx(auVar92,auVar126);
      uVar14 = vcmpps_avx512vl(auVar100,auVar104,6);
      bVar74 = (byte)uVar13 | (byte)uVar14;
      auVar127._0_4_ = (uint)(bVar74 & 1) * 0x7f800000 | (uint)!(bool)(bVar74 & 1) * (int)fVar145;
      bVar5 = (bool)(bVar74 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar232;
      bVar5 = (bool)(bVar74 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar234;
      bVar5 = (bool)(bVar74 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar236;
      bVar5 = (bool)(bVar74 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar243;
      bVar5 = (bool)(bVar74 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar238;
      bVar5 = (bool)(bVar74 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar207;
      auVar127._28_4_ =
           (uint)(bVar74 >> 7) * 0x7f800000 | (uint)!(bool)(bVar74 >> 7) * auVar95._28_4_;
      local_460 = vminps_avx(auVar107,auVar127);
      uVar13 = vcmpps_avx512vl(_local_680,local_460,2);
      bVar69 = bVar69 & 0x7f & (byte)uVar13;
      if (bVar69 == 0) {
        auVar212 = ZEXT3264(_DAT_02020f20);
        auVar250 = ZEXT3264(local_880);
        auVar251 = ZEXT3264(local_8a0);
      }
      else {
        auVar101 = vmaxps_avx512vl(auVar112,local_7e0);
        auVar95 = vminps_avx512vl(local_4e0,auVar154);
        auVar55 = ZEXT412(0);
        auVar100 = ZEXT1232(auVar55) << 0x20;
        auVar95 = vmaxps_avx(auVar95,ZEXT1232(auVar55) << 0x20);
        auVar104 = vminps_avx512vl(local_500,auVar154);
        auVar50._4_4_ = (auVar95._4_4_ + 1.0) * 0.125;
        auVar50._0_4_ = (auVar95._0_4_ + 0.0) * 0.125;
        auVar50._8_4_ = (auVar95._8_4_ + 2.0) * 0.125;
        auVar50._12_4_ = (auVar95._12_4_ + 3.0) * 0.125;
        auVar50._16_4_ = (auVar95._16_4_ + 4.0) * 0.125;
        auVar50._20_4_ = (auVar95._20_4_ + 5.0) * 0.125;
        auVar50._24_4_ = (auVar95._24_4_ + 6.0) * 0.125;
        auVar50._28_4_ = auVar95._28_4_ + 7.0;
        auVar82 = vfmadd213ps_fma(auVar50,local_7c0,auVar226);
        local_4e0 = ZEXT1632(auVar82);
        auVar95 = vmaxps_avx(auVar104,ZEXT1232(auVar55) << 0x20);
        auVar51._4_4_ = (auVar95._4_4_ + 1.0) * 0.125;
        auVar51._0_4_ = (auVar95._0_4_ + 0.0) * 0.125;
        auVar51._8_4_ = (auVar95._8_4_ + 2.0) * 0.125;
        auVar51._12_4_ = (auVar95._12_4_ + 3.0) * 0.125;
        auVar51._16_4_ = (auVar95._16_4_ + 4.0) * 0.125;
        auVar51._20_4_ = (auVar95._20_4_ + 5.0) * 0.125;
        auVar51._24_4_ = (auVar95._24_4_ + 6.0) * 0.125;
        auVar51._28_4_ = auVar95._28_4_ + 7.0;
        auVar82 = vfmadd213ps_fma(auVar51,local_7c0,auVar226);
        local_500 = ZEXT1632(auVar82);
        auVar159._0_4_ = auVar101._0_4_ * auVar101._0_4_;
        auVar159._4_4_ = auVar101._4_4_ * auVar101._4_4_;
        auVar159._8_4_ = auVar101._8_4_ * auVar101._8_4_;
        auVar159._12_4_ = auVar101._12_4_ * auVar101._12_4_;
        auVar159._16_4_ = auVar101._16_4_ * auVar101._16_4_;
        auVar159._20_4_ = auVar101._20_4_ * auVar101._20_4_;
        auVar159._24_4_ = auVar101._24_4_ * auVar101._24_4_;
        auVar159._28_4_ = 0;
        auVar95 = vsubps_avx(auVar110,auVar159);
        auVar101 = vmulps_avx512vl(auVar114,auVar95);
        auVar101 = vsubps_avx512vl(auVar113,auVar101);
        uVar13 = vcmpps_avx512vl(auVar101,ZEXT1232(auVar55) << 0x20,5);
        bVar74 = (byte)uVar13;
        if (bVar74 == 0) {
          auVar96 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar94 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar104 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar105 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar101 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar128._8_4_ = 0x7f800000;
          auVar128._0_8_ = 0x7f8000007f800000;
          auVar128._12_4_ = 0x7f800000;
          auVar128._16_4_ = 0x7f800000;
          auVar128._20_4_ = 0x7f800000;
          auVar128._24_4_ = 0x7f800000;
          auVar128._28_4_ = 0x7f800000;
          auVar129._8_4_ = 0xff800000;
          auVar129._0_8_ = 0xff800000ff800000;
          auVar129._12_4_ = 0xff800000;
          auVar129._16_4_ = 0xff800000;
          auVar129._20_4_ = 0xff800000;
          auVar129._24_4_ = 0xff800000;
          auVar129._28_4_ = 0xff800000;
        }
        else {
          auVar84 = vxorps_avx512vl(auVar105._0_16_,auVar105._0_16_);
          uVar78 = vcmpps_avx512vl(auVar101,auVar112,5);
          auVar100 = vsqrtps_avx(auVar101);
          auVar183._0_4_ = auVar102._0_4_ + auVar102._0_4_;
          auVar183._4_4_ = auVar102._4_4_ + auVar102._4_4_;
          auVar183._8_4_ = auVar102._8_4_ + auVar102._8_4_;
          auVar183._12_4_ = auVar102._12_4_ + auVar102._12_4_;
          auVar183._16_4_ = auVar102._16_4_ + auVar102._16_4_;
          auVar183._20_4_ = auVar102._20_4_ + auVar102._20_4_;
          auVar183._24_4_ = auVar102._24_4_ + auVar102._24_4_;
          auVar183._28_4_ = auVar102._28_4_ + auVar102._28_4_;
          auVar101 = vrcp14ps_avx512vl(auVar183);
          auVar104 = vfnmadd213ps_avx512vl(auVar183,auVar101,auVar154);
          auVar82 = vfmadd132ps_fma(auVar104,auVar101,auVar101);
          auVar28._8_4_ = 0x80000000;
          auVar28._0_8_ = 0x8000000080000000;
          auVar28._12_4_ = 0x80000000;
          auVar28._16_4_ = 0x80000000;
          auVar28._20_4_ = 0x80000000;
          auVar28._24_4_ = 0x80000000;
          auVar28._28_4_ = 0x80000000;
          auVar101 = vxorps_avx512vl(auVar109,auVar28);
          auVar101 = vsubps_avx(auVar101,auVar100);
          auVar52._4_4_ = auVar101._4_4_ * auVar82._4_4_;
          auVar52._0_4_ = auVar101._0_4_ * auVar82._0_4_;
          auVar52._8_4_ = auVar101._8_4_ * auVar82._8_4_;
          auVar52._12_4_ = auVar101._12_4_ * auVar82._12_4_;
          auVar52._16_4_ = auVar101._16_4_ * 0.0;
          auVar52._20_4_ = auVar101._20_4_ * 0.0;
          auVar52._24_4_ = auVar101._24_4_ * 0.0;
          auVar52._28_4_ = 0x3e000000;
          auVar100 = vsubps_avx512vl(auVar100,auVar109);
          auVar53._4_4_ = auVar100._4_4_ * auVar82._4_4_;
          auVar53._0_4_ = auVar100._0_4_ * auVar82._0_4_;
          auVar53._8_4_ = auVar100._8_4_ * auVar82._8_4_;
          auVar53._12_4_ = auVar100._12_4_ * auVar82._12_4_;
          auVar53._16_4_ = auVar100._16_4_ * 0.0;
          auVar53._20_4_ = auVar100._20_4_ * 0.0;
          auVar53._24_4_ = auVar100._24_4_ * 0.0;
          auVar53._28_4_ = fVar166;
          auVar100 = vfmadd213ps_avx512vl(auVar111,auVar52,auVar96);
          auVar54._4_4_ = auVar94._4_4_ * auVar100._4_4_;
          auVar54._0_4_ = auVar94._0_4_ * auVar100._0_4_;
          auVar54._8_4_ = auVar94._8_4_ * auVar100._8_4_;
          auVar54._12_4_ = auVar94._12_4_ * auVar100._12_4_;
          auVar54._16_4_ = auVar94._16_4_ * auVar100._16_4_;
          auVar54._20_4_ = auVar94._20_4_ * auVar100._20_4_;
          auVar54._24_4_ = auVar94._24_4_ * auVar100._24_4_;
          auVar54._28_4_ = auVar101._28_4_;
          auVar100 = vmulps_avx512vl(local_880,auVar52);
          auVar101 = vmulps_avx512vl(local_8a0,auVar52);
          auVar91 = vmulps_avx512vl(local_800,auVar52);
          auVar104 = vfmadd213ps_avx512vl(auVar97,auVar54,auVar99);
          auVar104 = vsubps_avx512vl(auVar100,auVar104);
          auVar100 = vfmadd213ps_avx512vl(auVar98,auVar54,auVar103);
          auVar105 = vsubps_avx512vl(auVar101,auVar100);
          auVar82 = vfmadd213ps_fma(auVar54,auVar106,auVar93);
          auVar101 = vsubps_avx(auVar91,ZEXT1632(auVar82));
          auVar96 = vfmadd213ps_avx512vl(auVar111,auVar53,auVar96);
          auVar94 = vmulps_avx512vl(auVar94,auVar96);
          auVar96 = vmulps_avx512vl(local_880,auVar53);
          auVar91 = vmulps_avx512vl(local_8a0,auVar53);
          auVar92 = vmulps_avx512vl(local_800,auVar53);
          auVar82 = vfmadd213ps_fma(auVar97,auVar94,auVar99);
          auVar100 = vsubps_avx(auVar96,ZEXT1632(auVar82));
          auVar82 = vfmadd213ps_fma(auVar98,auVar94,auVar103);
          auVar96 = vsubps_avx512vl(auVar91,ZEXT1632(auVar82));
          auVar82 = vfmadd213ps_fma(auVar106,auVar94,auVar93);
          auVar94 = vsubps_avx512vl(auVar92,ZEXT1632(auVar82));
          auVar201._8_4_ = 0x7f800000;
          auVar201._0_8_ = 0x7f8000007f800000;
          auVar201._12_4_ = 0x7f800000;
          auVar201._16_4_ = 0x7f800000;
          auVar201._20_4_ = 0x7f800000;
          auVar201._24_4_ = 0x7f800000;
          auVar201._28_4_ = 0x7f800000;
          auVar97 = vblendmps_avx512vl(auVar201,auVar52);
          bVar5 = (bool)((byte)uVar78 & 1);
          auVar128._0_4_ = (uint)bVar5 * auVar97._0_4_ | (uint)!bVar5 * auVar99._0_4_;
          bVar5 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar5 * auVar97._4_4_ | (uint)!bVar5 * auVar99._4_4_;
          bVar5 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar5 * auVar97._8_4_ | (uint)!bVar5 * auVar99._8_4_;
          bVar5 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar5 * auVar97._12_4_ | (uint)!bVar5 * auVar99._12_4_;
          bVar5 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar128._16_4_ = (uint)bVar5 * auVar97._16_4_ | (uint)!bVar5 * auVar99._16_4_;
          bVar5 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar128._20_4_ = (uint)bVar5 * auVar97._20_4_ | (uint)!bVar5 * auVar99._20_4_;
          bVar5 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar128._24_4_ = (uint)bVar5 * auVar97._24_4_ | (uint)!bVar5 * auVar99._24_4_;
          bVar5 = SUB81(uVar78 >> 7,0);
          auVar128._28_4_ = (uint)bVar5 * auVar97._28_4_ | (uint)!bVar5 * auVar99._28_4_;
          auVar202._8_4_ = 0xff800000;
          auVar202._0_8_ = 0xff800000ff800000;
          auVar202._12_4_ = 0xff800000;
          auVar202._16_4_ = 0xff800000;
          auVar202._20_4_ = 0xff800000;
          auVar202._24_4_ = 0xff800000;
          auVar202._28_4_ = 0xff800000;
          auVar97 = vblendmps_avx512vl(auVar202,auVar53);
          bVar5 = (bool)((byte)uVar78 & 1);
          auVar129._0_4_ = (uint)bVar5 * auVar97._0_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar5 * auVar97._4_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar5 * auVar97._8_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar5 * auVar97._12_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar129._16_4_ = (uint)bVar5 * auVar97._16_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar129._20_4_ = (uint)bVar5 * auVar97._20_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar129._24_4_ = (uint)bVar5 * auVar97._24_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = SUB81(uVar78 >> 7,0);
          auVar129._28_4_ = (uint)bVar5 * auVar97._28_4_ | (uint)!bVar5 * -0x800000;
          auVar240._8_4_ = 0x7fffffff;
          auVar240._0_8_ = 0x7fffffff7fffffff;
          auVar240._12_4_ = 0x7fffffff;
          auVar240._16_4_ = 0x7fffffff;
          auVar240._20_4_ = 0x7fffffff;
          auVar240._24_4_ = 0x7fffffff;
          auVar240._28_4_ = 0x7fffffff;
          auVar97 = vandps_avx(auVar240,local_640);
          auVar97 = vmaxps_avx(local_4a0,auVar97);
          auVar29._8_4_ = 0x36000000;
          auVar29._0_8_ = 0x3600000036000000;
          auVar29._12_4_ = 0x36000000;
          auVar29._16_4_ = 0x36000000;
          auVar29._20_4_ = 0x36000000;
          auVar29._24_4_ = 0x36000000;
          auVar29._28_4_ = 0x36000000;
          auVar98 = vmulps_avx512vl(auVar97,auVar29);
          auVar97 = vandps_avx(auVar102,auVar240);
          uVar71 = vcmpps_avx512vl(auVar97,auVar98,1);
          uVar78 = uVar78 & uVar71;
          bVar72 = (byte)uVar78;
          if (bVar72 != 0) {
            uVar71 = vcmpps_avx512vl(auVar95,ZEXT1632(auVar84),2);
            auVar241._8_4_ = 0xff800000;
            auVar241._0_8_ = 0xff800000ff800000;
            auVar241._12_4_ = 0xff800000;
            auVar241._16_4_ = 0xff800000;
            auVar241._20_4_ = 0xff800000;
            auVar241._24_4_ = 0xff800000;
            auVar241._28_4_ = 0xff800000;
            auVar245._8_4_ = 0x7f800000;
            auVar245._0_8_ = 0x7f8000007f800000;
            auVar245._12_4_ = 0x7f800000;
            auVar245._16_4_ = 0x7f800000;
            auVar245._20_4_ = 0x7f800000;
            auVar245._24_4_ = 0x7f800000;
            auVar245._28_4_ = 0x7f800000;
            auVar97 = vblendmps_avx512vl(auVar245,auVar241);
            bVar70 = (byte)uVar71;
            uVar79 = (uint)(bVar70 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar98._0_4_;
            bVar5 = (bool)((byte)(uVar71 >> 1) & 1);
            uVar138 = (uint)bVar5 * auVar97._4_4_ | (uint)!bVar5 * auVar98._4_4_;
            bVar5 = (bool)((byte)(uVar71 >> 2) & 1);
            uVar139 = (uint)bVar5 * auVar97._8_4_ | (uint)!bVar5 * auVar98._8_4_;
            bVar5 = (bool)((byte)(uVar71 >> 3) & 1);
            uVar140 = (uint)bVar5 * auVar97._12_4_ | (uint)!bVar5 * auVar98._12_4_;
            bVar5 = (bool)((byte)(uVar71 >> 4) & 1);
            uVar141 = (uint)bVar5 * auVar97._16_4_ | (uint)!bVar5 * auVar98._16_4_;
            bVar5 = (bool)((byte)(uVar71 >> 5) & 1);
            uVar142 = (uint)bVar5 * auVar97._20_4_ | (uint)!bVar5 * auVar98._20_4_;
            bVar5 = (bool)((byte)(uVar71 >> 6) & 1);
            uVar143 = (uint)bVar5 * auVar97._24_4_ | (uint)!bVar5 * auVar98._24_4_;
            bVar5 = SUB81(uVar71 >> 7,0);
            uVar144 = (uint)bVar5 * auVar97._28_4_ | (uint)!bVar5 * auVar98._28_4_;
            auVar128._0_4_ = (bVar72 & 1) * uVar79 | !(bool)(bVar72 & 1) * auVar128._0_4_;
            bVar5 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar128._4_4_ = bVar5 * uVar138 | !bVar5 * auVar128._4_4_;
            bVar5 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar128._8_4_ = bVar5 * uVar139 | !bVar5 * auVar128._8_4_;
            bVar5 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar128._12_4_ = bVar5 * uVar140 | !bVar5 * auVar128._12_4_;
            bVar5 = (bool)((byte)(uVar78 >> 4) & 1);
            auVar128._16_4_ = bVar5 * uVar141 | !bVar5 * auVar128._16_4_;
            bVar5 = (bool)((byte)(uVar78 >> 5) & 1);
            auVar128._20_4_ = bVar5 * uVar142 | !bVar5 * auVar128._20_4_;
            bVar5 = (bool)((byte)(uVar78 >> 6) & 1);
            auVar128._24_4_ = bVar5 * uVar143 | !bVar5 * auVar128._24_4_;
            bVar5 = SUB81(uVar78 >> 7,0);
            auVar128._28_4_ = bVar5 * uVar144 | !bVar5 * auVar128._28_4_;
            auVar97 = vblendmps_avx512vl(auVar241,auVar245);
            bVar5 = (bool)((byte)(uVar71 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar71 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar71 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar71 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar71 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar71 >> 6) & 1);
            bVar11 = SUB81(uVar71 >> 7,0);
            auVar129._0_4_ =
                 (uint)(bVar72 & 1) *
                 ((uint)(bVar70 & 1) * auVar97._0_4_ | !(bool)(bVar70 & 1) * uVar79) |
                 !(bool)(bVar72 & 1) * auVar129._0_4_;
            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar129._4_4_ =
                 (uint)bVar77 * ((uint)bVar5 * auVar97._4_4_ | !bVar5 * uVar138) |
                 !bVar77 * auVar129._4_4_;
            bVar5 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar129._8_4_ =
                 (uint)bVar5 * ((uint)bVar6 * auVar97._8_4_ | !bVar6 * uVar139) |
                 !bVar5 * auVar129._8_4_;
            bVar5 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar129._12_4_ =
                 (uint)bVar5 * ((uint)bVar7 * auVar97._12_4_ | !bVar7 * uVar140) |
                 !bVar5 * auVar129._12_4_;
            bVar5 = (bool)((byte)(uVar78 >> 4) & 1);
            auVar129._16_4_ =
                 (uint)bVar5 * ((uint)bVar8 * auVar97._16_4_ | !bVar8 * uVar141) |
                 !bVar5 * auVar129._16_4_;
            bVar5 = (bool)((byte)(uVar78 >> 5) & 1);
            auVar129._20_4_ =
                 (uint)bVar5 * ((uint)bVar9 * auVar97._20_4_ | !bVar9 * uVar142) |
                 !bVar5 * auVar129._20_4_;
            bVar5 = (bool)((byte)(uVar78 >> 6) & 1);
            auVar129._24_4_ =
                 (uint)bVar5 * ((uint)bVar10 * auVar97._24_4_ | !bVar10 * uVar143) |
                 !bVar5 * auVar129._24_4_;
            bVar5 = SUB81(uVar78 >> 7,0);
            auVar129._28_4_ =
                 (uint)bVar5 * ((uint)bVar11 * auVar97._28_4_ | !bVar11 * uVar144) |
                 !bVar5 * auVar129._28_4_;
            bVar74 = (~bVar72 | bVar70) & bVar74;
          }
        }
        auVar251 = ZEXT3264(local_8a0);
        auVar250 = ZEXT3264(local_880);
        auVar94 = vmulps_avx512vl(local_800,auVar94);
        auVar96 = vfmadd231ps_avx512vl(auVar94,local_8a0,auVar96);
        auVar96 = vfmadd231ps_avx512vl(auVar96,local_880,auVar100);
        _local_1c0 = _local_680;
        local_1a0 = vminps_avx(local_460,auVar128);
        auVar231._8_4_ = 0x7fffffff;
        auVar231._0_8_ = 0x7fffffff7fffffff;
        auVar231._12_4_ = 0x7fffffff;
        auVar231._16_4_ = 0x7fffffff;
        auVar231._20_4_ = 0x7fffffff;
        auVar231._24_4_ = 0x7fffffff;
        auVar231._28_4_ = 0x7fffffff;
        auVar96 = vandps_avx(auVar96,auVar231);
        auVar222 = ZEXT3264(auVar96);
        _local_480 = vmaxps_avx(_local_680,auVar129);
        auVar203._8_4_ = 0x3e99999a;
        auVar203._0_8_ = 0x3e99999a3e99999a;
        auVar203._12_4_ = 0x3e99999a;
        auVar203._16_4_ = 0x3e99999a;
        auVar203._20_4_ = 0x3e99999a;
        auVar203._24_4_ = 0x3e99999a;
        auVar203._28_4_ = 0x3e99999a;
        uVar13 = vcmpps_avx512vl(auVar96,auVar203,1);
        local_8ac = (undefined4)uVar13;
        uVar13 = vcmpps_avx512vl(_local_680,local_1a0,2);
        bVar72 = (byte)uVar13 & bVar69;
        _local_540 = _local_480;
        uVar14 = vcmpps_avx512vl(_local_480,local_460,2);
        if ((bVar69 & ((byte)uVar14 | (byte)uVar13)) == 0) {
          auVar212 = ZEXT3264(_DAT_02020f20);
        }
        else {
          auVar96 = vmulps_avx512vl(local_800,auVar101);
          auVar96 = vfmadd213ps_avx512vl(auVar105,local_8a0,auVar96);
          auVar96 = vfmadd213ps_avx512vl(auVar104,local_880,auVar96);
          auVar96 = vandps_avx(auVar96,auVar231);
          uVar13 = vcmpps_avx512vl(auVar96,auVar203,1);
          local_8b4 = (uint)(byte)~bVar74;
          bVar74 = (byte)uVar13 | ~bVar74;
          auVar160._8_4_ = 2;
          auVar160._0_8_ = 0x200000002;
          auVar160._12_4_ = 2;
          auVar160._16_4_ = 2;
          auVar160._20_4_ = 2;
          auVar160._24_4_ = 2;
          auVar160._28_4_ = 2;
          auVar30._8_4_ = 3;
          auVar30._0_8_ = 0x300000003;
          auVar30._12_4_ = 3;
          auVar30._16_4_ = 3;
          auVar30._20_4_ = 3;
          auVar30._24_4_ = 3;
          auVar30._28_4_ = 3;
          auVar96 = vpblendmd_avx512vl(auVar160,auVar30);
          local_440._0_4_ = (uint)(bVar74 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar74 & 1) * 2;
          bVar5 = (bool)(bVar74 >> 1 & 1);
          local_440._4_4_ = (uint)bVar5 * auVar96._4_4_ | (uint)!bVar5 * 2;
          bVar5 = (bool)(bVar74 >> 2 & 1);
          local_440._8_4_ = (uint)bVar5 * auVar96._8_4_ | (uint)!bVar5 * 2;
          bVar5 = (bool)(bVar74 >> 3 & 1);
          local_440._12_4_ = (uint)bVar5 * auVar96._12_4_ | (uint)!bVar5 * 2;
          bVar5 = (bool)(bVar74 >> 4 & 1);
          local_440._16_4_ = (uint)bVar5 * auVar96._16_4_ | (uint)!bVar5 * 2;
          bVar5 = (bool)(bVar74 >> 5 & 1);
          local_440._20_4_ = (uint)bVar5 * auVar96._20_4_ | (uint)!bVar5 * 2;
          bVar5 = (bool)(bVar74 >> 6 & 1);
          local_440._24_4_ = (uint)bVar5 * auVar96._24_4_ | (uint)!bVar5 * 2;
          local_440._28_4_ = (uint)(bVar74 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar74 >> 7) * 2;
          local_4c0 = vpbroadcastd_avx512vl();
          uVar13 = vpcmpd_avx512vl(local_4c0,local_440,5);
          local_8b0 = (uint)bVar72;
          bVar72 = (byte)uVar13 & bVar72;
          auVar213._8_4_ = 0x7fffffff;
          auVar213._0_8_ = 0x7fffffff7fffffff;
          auVar213._12_4_ = 0x7fffffff;
          auVar222 = ZEXT1664(auVar213);
          if (bVar72 != 0) {
            auVar84 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar82 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar80 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
            auVar85 = vminps_avx(auVar84,auVar80);
            auVar84 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
            auVar80 = vmaxps_avx(auVar82,auVar84);
            auVar82 = vandps_avx(auVar85,auVar213);
            auVar84 = vandps_avx(auVar80,auVar213);
            auVar82 = vmaxps_avx(auVar82,auVar84);
            auVar84 = vmovshdup_avx(auVar82);
            auVar84 = vmaxss_avx(auVar84,auVar82);
            auVar82 = vshufpd_avx(auVar82,auVar82,1);
            auVar82 = vmaxss_avx(auVar82,auVar84);
            fVar145 = auVar82._0_4_ * 1.9073486e-06;
            local_780 = vshufps_avx(auVar80,auVar80,0xff);
            local_520 = (float)local_680._0_4_ + (float)local_660._0_4_;
            fStack_51c = (float)local_680._4_4_ + (float)local_660._4_4_;
            fStack_518 = fStack_678 + fStack_658;
            fStack_514 = fStack_674 + fStack_654;
            fStack_510 = fStack_670 + fStack_650;
            fStack_50c = fStack_66c + fStack_64c;
            fStack_508 = fStack_668 + fStack_648;
            fStack_504 = fStack_664 + fStack_644;
            do {
              auVar161._8_4_ = 0x7f800000;
              auVar161._0_8_ = 0x7f8000007f800000;
              auVar161._12_4_ = 0x7f800000;
              auVar161._16_4_ = 0x7f800000;
              auVar161._20_4_ = 0x7f800000;
              auVar161._24_4_ = 0x7f800000;
              auVar161._28_4_ = 0x7f800000;
              auVar96 = vblendmps_avx512vl(auVar161,_local_680);
              auVar130._0_4_ =
                   (uint)(bVar72 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar72 & 1) * 0x7f800000;
              bVar5 = (bool)(bVar72 >> 1 & 1);
              auVar130._4_4_ = (uint)bVar5 * auVar96._4_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar72 >> 2 & 1);
              auVar130._8_4_ = (uint)bVar5 * auVar96._8_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar72 >> 3 & 1);
              auVar130._12_4_ = (uint)bVar5 * auVar96._12_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar72 >> 4 & 1);
              auVar130._16_4_ = (uint)bVar5 * auVar96._16_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar72 >> 5 & 1);
              auVar130._20_4_ = (uint)bVar5 * auVar96._20_4_ | (uint)!bVar5 * 0x7f800000;
              auVar130._24_4_ =
                   (uint)(bVar72 >> 6) * auVar96._24_4_ | (uint)!(bool)(bVar72 >> 6) * 0x7f800000;
              auVar130._28_4_ = 0x7f800000;
              auVar96 = vshufps_avx(auVar130,auVar130,0xb1);
              auVar96 = vminps_avx(auVar130,auVar96);
              auVar94 = vshufpd_avx(auVar96,auVar96,5);
              auVar96 = vminps_avx(auVar96,auVar94);
              auVar94 = vpermpd_avx2(auVar96,0x4e);
              auVar96 = vminps_avx(auVar96,auVar94);
              uVar13 = vcmpps_avx512vl(auVar130,auVar96,0);
              bVar70 = (byte)uVar13 & bVar72;
              bVar74 = bVar72;
              if (bVar70 != 0) {
                bVar74 = bVar70;
              }
              iVar16 = 0;
              for (uVar79 = (uint)bVar74; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                iVar16 = iVar16 + 1;
              }
              fVar232 = *(float *)(local_4e0 + (uint)(iVar16 << 2));
              fVar234 = *(float *)(local_1c0 + (uint)(iVar16 << 2));
              fVar236 = local_8a8;
              if ((float)local_7a0._0_4_ < 0.0) {
                fVar236 = sqrtf((float)local_7a0._0_4_);
              }
              lVar76 = 4;
              do {
                auVar146._4_4_ = fVar234;
                auVar146._0_4_ = fVar234;
                auVar146._8_4_ = fVar234;
                auVar146._12_4_ = fVar234;
                auVar84 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_790);
                fVar243 = 1.0 - fVar232;
                auVar189._0_4_ = local_6e0._0_4_ * fVar232;
                auVar189._4_4_ = local_6e0._4_4_ * fVar232;
                auVar189._8_4_ = local_6e0._8_4_ * fVar232;
                auVar189._12_4_ = local_6e0._12_4_ * fVar232;
                local_720 = ZEXT416((uint)fVar243);
                auVar209._4_4_ = fVar243;
                auVar209._0_4_ = fVar243;
                auVar209._8_4_ = fVar243;
                auVar209._12_4_ = fVar243;
                auVar82 = vfmadd231ps_fma(auVar189,auVar209,local_6a0._0_16_);
                auVar214._0_4_ = local_6c0._0_4_ * fVar232;
                auVar214._4_4_ = local_6c0._4_4_ * fVar232;
                auVar214._8_4_ = local_6c0._8_4_ * fVar232;
                auVar214._12_4_ = local_6c0._12_4_ * fVar232;
                auVar80 = vfmadd231ps_fma(auVar214,auVar209,local_6e0._0_16_);
                auVar224._0_4_ = fVar232 * (float)local_700._0_4_;
                auVar224._4_4_ = fVar232 * (float)local_700._4_4_;
                auVar224._8_4_ = fVar232 * fStack_6f8;
                auVar224._12_4_ = fVar232 * fStack_6f4;
                auVar85 = vfmadd231ps_fma(auVar224,auVar209,local_6c0._0_16_);
                auVar229._0_4_ = fVar232 * auVar80._0_4_;
                auVar229._4_4_ = fVar232 * auVar80._4_4_;
                auVar229._8_4_ = fVar232 * auVar80._8_4_;
                auVar229._12_4_ = fVar232 * auVar80._12_4_;
                auVar82 = vfmadd231ps_fma(auVar229,auVar209,auVar82);
                auVar190._0_4_ = fVar232 * auVar85._0_4_;
                auVar190._4_4_ = fVar232 * auVar85._4_4_;
                auVar190._8_4_ = fVar232 * auVar85._8_4_;
                auVar190._12_4_ = fVar232 * auVar85._12_4_;
                auVar80 = vfmadd231ps_fma(auVar190,auVar209,auVar80);
                auVar215._0_4_ = fVar232 * auVar80._0_4_;
                auVar215._4_4_ = fVar232 * auVar80._4_4_;
                auVar215._8_4_ = fVar232 * auVar80._8_4_;
                auVar215._12_4_ = fVar232 * auVar80._12_4_;
                auVar85 = vfmadd231ps_fma(auVar215,auVar82,auVar209);
                auVar82 = vsubps_avx(auVar80,auVar82);
                auVar17._8_4_ = 0x40400000;
                auVar17._0_8_ = 0x4040000040400000;
                auVar17._12_4_ = 0x40400000;
                auVar80 = vmulps_avx512vl(auVar82,auVar17);
                local_640._0_16_ = auVar85;
                auVar82 = vsubps_avx(auVar84,auVar85);
                local_7c0._0_16_ = auVar82;
                auVar82 = vdpps_avx(auVar82,auVar82,0x7f);
                local_7e0._0_16_ = auVar82;
                local_920 = ZEXT416((uint)fVar232);
                if (auVar82._0_4_ < 0.0) {
                  auVar222._0_4_ = sqrtf(auVar82._0_4_);
                  auVar222._4_60_ = extraout_var;
                  auVar82 = auVar222._0_16_;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar82,auVar82);
                }
                local_730 = vdpps_avx(auVar80,auVar80,0x7f);
                fVar243 = local_730._0_4_;
                auVar191._4_12_ = ZEXT812(0) << 0x20;
                auVar191._0_4_ = fVar243;
                auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar191);
                fVar166 = auVar84._0_4_;
                local_740 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar191);
                auVar18._8_4_ = 0x80000000;
                auVar18._0_8_ = 0x8000000080000000;
                auVar18._12_4_ = 0x80000000;
                auVar85 = vxorps_avx512vl(local_730,auVar18);
                auVar84 = vfnmadd213ss_fma(local_740,local_730,ZEXT416(0x40000000));
                uVar79 = auVar82._0_4_;
                if (fVar243 < auVar85._0_4_) {
                  fVar238 = sqrtf(fVar243);
                  auVar82 = ZEXT416(uVar79);
                }
                else {
                  auVar85 = vsqrtss_avx(local_730,local_730);
                  fVar238 = auVar85._0_4_;
                }
                fVar243 = fVar166 * 1.5 + fVar243 * -0.5 * fVar166 * fVar166 * fVar166;
                auVar147._0_4_ = auVar80._0_4_ * fVar243;
                auVar147._4_4_ = auVar80._4_4_ * fVar243;
                auVar147._8_4_ = auVar80._8_4_ * fVar243;
                auVar147._12_4_ = auVar80._12_4_ * fVar243;
                auVar85 = vdpps_avx(local_7c0._0_16_,auVar147,0x7f);
                fVar239 = auVar82._0_4_;
                fVar166 = auVar85._0_4_;
                auVar148._0_4_ = fVar166 * fVar166;
                auVar148._4_4_ = auVar85._4_4_ * auVar85._4_4_;
                auVar148._8_4_ = auVar85._8_4_ * auVar85._8_4_;
                auVar148._12_4_ = auVar85._12_4_ * auVar85._12_4_;
                auVar86 = vsubps_avx512vl(local_7e0._0_16_,auVar148);
                fVar207 = auVar86._0_4_;
                auVar168._4_12_ = ZEXT812(0) << 0x20;
                auVar168._0_4_ = fVar207;
                auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar168);
                auVar88 = vmulss_avx512f(auVar87,ZEXT416(0x3fc00000));
                auVar81 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
                if (fVar207 < 0.0) {
                  local_760 = fVar243;
                  fStack_75c = fVar243;
                  fStack_758 = fVar243;
                  fStack_754 = fVar243;
                  local_750 = auVar87;
                  fVar207 = sqrtf(fVar207);
                  auVar81 = ZEXT416(auVar81._0_4_);
                  auVar88 = ZEXT416(auVar88._0_4_);
                  auVar82 = ZEXT416(uVar79);
                  auVar87 = local_750;
                  fVar243 = local_760;
                  fVar233 = fStack_75c;
                  fVar235 = fStack_758;
                  fVar237 = fStack_754;
                }
                else {
                  auVar86 = vsqrtss_avx(auVar86,auVar86);
                  fVar207 = auVar86._0_4_;
                  fVar233 = fVar243;
                  fVar235 = fVar243;
                  fVar237 = fVar243;
                }
                auVar250 = ZEXT3264(local_880);
                auVar251 = ZEXT3264(local_8a0);
                auVar249 = ZEXT3264(local_800);
                auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_920,local_720);
                fVar167 = auVar86._0_4_ * 6.0;
                fVar12 = fVar232 * 6.0;
                auVar192._0_4_ = fVar12 * (float)local_700._0_4_;
                auVar192._4_4_ = fVar12 * (float)local_700._4_4_;
                auVar192._8_4_ = fVar12 * fStack_6f8;
                auVar192._12_4_ = fVar12 * fStack_6f4;
                auVar169._4_4_ = fVar167;
                auVar169._0_4_ = fVar167;
                auVar169._8_4_ = fVar167;
                auVar169._12_4_ = fVar167;
                auVar86 = vfmadd132ps_fma(auVar169,auVar192,local_6c0._0_16_);
                auVar248 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_720,local_920);
                fVar167 = auVar248._0_4_ * 6.0;
                auVar193._4_4_ = fVar167;
                auVar193._0_4_ = fVar167;
                auVar193._8_4_ = fVar167;
                auVar193._12_4_ = fVar167;
                auVar86 = vfmadd132ps_fma(auVar193,auVar86,local_6e0._0_16_);
                fVar167 = local_720._0_4_ * 6.0;
                auVar170._4_4_ = fVar167;
                auVar170._0_4_ = fVar167;
                auVar170._8_4_ = fVar167;
                auVar170._12_4_ = fVar167;
                auVar86 = vfmadd132ps_fma(auVar170,auVar86,local_6a0._0_16_);
                auVar194._0_4_ = auVar86._0_4_ * (float)local_730._0_4_;
                auVar194._4_4_ = auVar86._4_4_ * (float)local_730._0_4_;
                auVar194._8_4_ = auVar86._8_4_ * (float)local_730._0_4_;
                auVar194._12_4_ = auVar86._12_4_ * (float)local_730._0_4_;
                auVar86 = vdpps_avx(auVar80,auVar86,0x7f);
                fVar167 = auVar86._0_4_;
                auVar171._0_4_ = auVar80._0_4_ * fVar167;
                auVar171._4_4_ = auVar80._4_4_ * fVar167;
                auVar171._8_4_ = auVar80._8_4_ * fVar167;
                auVar171._12_4_ = auVar80._12_4_ * fVar167;
                auVar86 = vsubps_avx(auVar194,auVar171);
                fVar167 = auVar84._0_4_ * (float)local_740._0_4_;
                auVar19._8_4_ = 0x80000000;
                auVar19._0_8_ = 0x8000000080000000;
                auVar19._12_4_ = 0x80000000;
                auVar132._16_16_ = local_800._16_16_;
                auVar89 = vxorps_avx512vl(auVar80,auVar19);
                auVar216._0_4_ = fVar243 * auVar86._0_4_ * fVar167;
                auVar216._4_4_ = fVar233 * auVar86._4_4_ * fVar167;
                auVar216._8_4_ = fVar235 * auVar86._8_4_ * fVar167;
                auVar216._12_4_ = fVar237 * auVar86._12_4_ * fVar167;
                auVar84 = vdpps_avx(auVar89,auVar147,0x7f);
                auVar248 = vmaxss_avx(ZEXT416((uint)fVar145),
                                      ZEXT416((uint)(fVar234 * fVar236 * 1.9073486e-06)));
                auVar86 = vdpps_avx(local_7c0._0_16_,auVar216,0x7f);
                auVar82 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar145),auVar248);
                auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar239 + 1.0)),
                                          ZEXT416((uint)(fVar145 / fVar238)),auVar82);
                auVar82 = vdpps_avx(local_790,auVar147,0x7f);
                fVar243 = auVar84._0_4_ + auVar86._0_4_;
                auVar84 = vdpps_avx(local_7c0._0_16_,auVar89,0x7f);
                auVar86 = vmulss_avx512f(auVar81,auVar87);
                auVar81 = vmulss_avx512f(auVar87,auVar87);
                auVar87 = vdpps_avx(local_7c0._0_16_,local_790,0x7f);
                auVar81 = vaddss_avx512f(auVar88,ZEXT416((uint)(auVar86._0_4_ * auVar81._0_4_)));
                auVar86 = vfnmadd231ss_fma(auVar84,auVar85,ZEXT416((uint)fVar243));
                auVar88 = vfnmadd231ss_fma(auVar87,auVar85,auVar82);
                auVar84 = vpermilps_avx(local_640._0_16_,0xff);
                fVar207 = fVar207 - auVar84._0_4_;
                auVar84 = vshufps_avx(auVar80,auVar80,0xff);
                auVar87 = vfmsub213ss_fma(auVar86,auVar81,auVar84);
                fVar238 = auVar88._0_4_ * auVar81._0_4_;
                auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar87._0_4_)),
                                          ZEXT416((uint)fVar243),ZEXT416((uint)fVar238));
                fVar239 = auVar86._0_4_;
                fVar232 = fVar232 - (fVar166 * (fVar238 / fVar239) -
                                    fVar207 * (auVar82._0_4_ / fVar239));
                fVar234 = fVar234 - (fVar207 * (fVar243 / fVar239) -
                                    fVar166 * (auVar87._0_4_ / fVar239));
                auVar217._8_4_ = 0x7fffffff;
                auVar217._0_8_ = 0x7fffffff7fffffff;
                auVar217._12_4_ = 0x7fffffff;
                auVar222 = ZEXT1664(auVar217);
                auVar82 = vandps_avx(auVar85,auVar217);
                if (auVar83._0_4_ <= auVar82._0_4_) {
LAB_01d74fd2:
                  bVar5 = false;
                }
                else {
                  auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ + auVar248._0_4_)),
                                            local_780,ZEXT416(0x36000000));
                  auVar82 = vandps_avx(ZEXT416((uint)fVar207),auVar217);
                  if (auVar85._0_4_ <= auVar82._0_4_) goto LAB_01d74fd2;
                  fVar234 = fVar234 + (float)local_770._0_4_;
                  bVar5 = true;
                  if ((((fVar208 <= fVar234) &&
                       (fVar243 = *(float *)(ray + k * 4 + 0x80), fVar234 <= fVar243)) &&
                      (0.0 <= fVar232)) && (fVar232 <= 1.0)) {
                    auVar132._0_16_ = ZEXT816(0) << 0x20;
                    auVar131._4_28_ = auVar132._4_28_;
                    auVar131._0_4_ = local_7e0._0_4_;
                    auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar131._0_16_);
                    fVar166 = auVar82._0_4_;
                    auVar82 = vmulss_avx512f(local_7e0._0_16_,ZEXT416(0xbf000000));
                    pGVar3 = (context->scene->geometries).items[uVar75].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar166 = fVar166 * 1.5 + auVar82._0_4_ * fVar166 * fVar166 * fVar166;
                      auVar172._0_4_ = local_7c0._0_4_ * fVar166;
                      auVar172._4_4_ = local_7c0._4_4_ * fVar166;
                      auVar172._8_4_ = local_7c0._8_4_ * fVar166;
                      auVar172._12_4_ = local_7c0._12_4_ * fVar166;
                      auVar85 = vfmadd213ps_fma(auVar84,auVar172,auVar80);
                      auVar82 = vshufps_avx(auVar172,auVar172,0xc9);
                      auVar84 = vshufps_avx(auVar80,auVar80,0xc9);
                      auVar173._0_4_ = auVar172._0_4_ * auVar84._0_4_;
                      auVar173._4_4_ = auVar172._4_4_ * auVar84._4_4_;
                      auVar173._8_4_ = auVar172._8_4_ * auVar84._8_4_;
                      auVar173._12_4_ = auVar172._12_4_ * auVar84._12_4_;
                      auVar80 = vfmsub231ps_fma(auVar173,auVar80,auVar82);
                      auVar82 = vshufps_avx(auVar80,auVar80,0xc9);
                      auVar84 = vshufps_avx(auVar85,auVar85,0xc9);
                      auVar80 = vshufps_avx(auVar80,auVar80,0xd2);
                      auVar149._0_4_ = auVar85._0_4_ * auVar80._0_4_;
                      auVar149._4_4_ = auVar85._4_4_ * auVar80._4_4_;
                      auVar149._8_4_ = auVar85._8_4_ * auVar80._8_4_;
                      auVar149._12_4_ = auVar85._12_4_ * auVar80._12_4_;
                      auVar82 = vfmsub231ps_fma(auVar149,auVar82,auVar84);
                      uVar242 = auVar82._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar234;
                        uVar2 = vextractps_avx(auVar82,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                        uVar2 = vextractps_avx(auVar82,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar242;
                        *(float *)(ray + k * 4 + 0xf0) = fVar232;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_808;
                        *(uint *)(ray + k * 4 + 0x120) = uVar75;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_5e0 = (RTCHitN  [16])vshufps_avx(auVar82,auVar82,0x55);
                        auStack_5d0 = vshufps_avx(auVar82,auVar82,0xaa);
                        local_5c0 = uVar242;
                        uStack_5bc = uVar242;
                        uStack_5b8 = uVar242;
                        uStack_5b4 = uVar242;
                        local_5b0 = fVar232;
                        fStack_5ac = fVar232;
                        fStack_5a8 = fVar232;
                        fStack_5a4 = fVar232;
                        local_5a0 = ZEXT416(0) << 0x20;
                        local_590 = local_600._0_8_;
                        uStack_588 = local_600._8_8_;
                        local_580 = local_5f0;
                        vpcmpeqd_avx2(ZEXT1632(local_5f0),ZEXT1632(local_5f0));
                        uStack_56c = context->user->instID[0];
                        local_570 = uStack_56c;
                        uStack_568 = uStack_56c;
                        uStack_564 = uStack_56c;
                        uStack_560 = context->user->instPrimID[0];
                        uStack_55c = uStack_560;
                        uStack_558 = uStack_560;
                        uStack_554 = uStack_560;
                        *(float *)(ray + k * 4 + 0x80) = fVar234;
                        local_8d0 = local_610._0_8_;
                        uStack_8c8 = local_610._8_8_;
                        local_860.valid = (int *)&local_8d0;
                        local_860.geometryUserPtr = pGVar3->userPtr;
                        local_860.context = context->user;
                        local_860.hit = local_5e0;
                        local_860.N = 4;
                        local_860.ray = (RTCRayN *)ray;
                        if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar3->intersectionFilterN)(&local_860);
                          auVar249 = ZEXT3264(local_800);
                          auVar251 = ZEXT3264(local_8a0);
                          auVar250 = ZEXT3264(local_880);
                          auVar222 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar59._8_8_ = uStack_8c8;
                        auVar59._0_8_ = local_8d0;
                        uVar78 = vptestmd_avx512vl(auVar59,auVar59);
                        if ((uVar78 & 0xf) != 0) {
                          p_Var4 = context->args->filter;
                          if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var4)(&local_860);
                            auVar249 = ZEXT3264(local_800);
                            auVar251 = ZEXT3264(local_8a0);
                            auVar250 = ZEXT3264(local_880);
                            auVar222 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar60._8_8_ = uStack_8c8;
                          auVar60._0_8_ = local_8d0;
                          uVar78 = vptestmd_avx512vl(auVar60,auVar60);
                          uVar78 = uVar78 & 0xf;
                          bVar74 = (byte)uVar78;
                          if (bVar74 != 0) {
                            iVar56 = *(int *)(local_860.hit + 4);
                            iVar57 = *(int *)(local_860.hit + 8);
                            iVar58 = *(int *)(local_860.hit + 0xc);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar7 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_860.ray + 0xc0) =
                                 (uint)(bVar74 & 1) * *(int *)local_860.hit |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_860.ray + 0xc0);
                            *(uint *)(local_860.ray + 0xc4) =
                                 (uint)bVar77 * iVar56 |
                                 (uint)!bVar77 * *(int *)(local_860.ray + 0xc4);
                            *(uint *)(local_860.ray + 200) =
                                 (uint)bVar6 * iVar57 | (uint)!bVar6 * *(int *)(local_860.ray + 200)
                            ;
                            *(uint *)(local_860.ray + 0xcc) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0xcc);
                            iVar56 = *(int *)(local_860.hit + 0x14);
                            iVar57 = *(int *)(local_860.hit + 0x18);
                            iVar58 = *(int *)(local_860.hit + 0x1c);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar7 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_860.ray + 0xd0) =
                                 (uint)(bVar74 & 1) * *(int *)(local_860.hit + 0x10) |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_860.ray + 0xd0);
                            *(uint *)(local_860.ray + 0xd4) =
                                 (uint)bVar77 * iVar56 |
                                 (uint)!bVar77 * *(int *)(local_860.ray + 0xd4);
                            *(uint *)(local_860.ray + 0xd8) =
                                 (uint)bVar6 * iVar57 |
                                 (uint)!bVar6 * *(int *)(local_860.ray + 0xd8);
                            *(uint *)(local_860.ray + 0xdc) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0xdc);
                            iVar56 = *(int *)(local_860.hit + 0x24);
                            iVar57 = *(int *)(local_860.hit + 0x28);
                            iVar58 = *(int *)(local_860.hit + 0x2c);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar7 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_860.ray + 0xe0) =
                                 (uint)(bVar74 & 1) * *(int *)(local_860.hit + 0x20) |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_860.ray + 0xe0);
                            *(uint *)(local_860.ray + 0xe4) =
                                 (uint)bVar77 * iVar56 |
                                 (uint)!bVar77 * *(int *)(local_860.ray + 0xe4);
                            *(uint *)(local_860.ray + 0xe8) =
                                 (uint)bVar6 * iVar57 |
                                 (uint)!bVar6 * *(int *)(local_860.ray + 0xe8);
                            *(uint *)(local_860.ray + 0xec) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0xec);
                            iVar56 = *(int *)(local_860.hit + 0x34);
                            iVar57 = *(int *)(local_860.hit + 0x38);
                            iVar58 = *(int *)(local_860.hit + 0x3c);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar7 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_860.ray + 0xf0) =
                                 (uint)(bVar74 & 1) * *(int *)(local_860.hit + 0x30) |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_860.ray + 0xf0);
                            *(uint *)(local_860.ray + 0xf4) =
                                 (uint)bVar77 * iVar56 |
                                 (uint)!bVar77 * *(int *)(local_860.ray + 0xf4);
                            *(uint *)(local_860.ray + 0xf8) =
                                 (uint)bVar6 * iVar57 |
                                 (uint)!bVar6 * *(int *)(local_860.ray + 0xf8);
                            *(uint *)(local_860.ray + 0xfc) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0xfc);
                            iVar56 = *(int *)(local_860.hit + 0x44);
                            iVar57 = *(int *)(local_860.hit + 0x48);
                            iVar58 = *(int *)(local_860.hit + 0x4c);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar7 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_860.ray + 0x100) =
                                 (uint)(bVar74 & 1) * *(int *)(local_860.hit + 0x40) |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_860.ray + 0x100);
                            *(uint *)(local_860.ray + 0x104) =
                                 (uint)bVar77 * iVar56 |
                                 (uint)!bVar77 * *(int *)(local_860.ray + 0x104);
                            *(uint *)(local_860.ray + 0x108) =
                                 (uint)bVar6 * iVar57 |
                                 (uint)!bVar6 * *(int *)(local_860.ray + 0x108);
                            *(uint *)(local_860.ray + 0x10c) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0x10c);
                            auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x50));
                            *(undefined1 (*) [16])(local_860.ray + 0x110) = auVar82;
                            auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x60));
                            *(undefined1 (*) [16])(local_860.ray + 0x120) = auVar82;
                            auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x70));
                            *(undefined1 (*) [16])(local_860.ray + 0x130) = auVar82;
                            auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x80));
                            *(undefined1 (*) [16])(local_860.ray + 0x140) = auVar82;
                            goto LAB_01d74fd5;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x80) = fVar243;
                      }
                    }
                  }
                }
LAB_01d74fd5:
                bVar77 = lVar76 != 0;
                lVar76 = lVar76 + -1;
              } while ((!bVar5) && (bVar77));
              auVar63._4_4_ = fStack_51c;
              auVar63._0_4_ = local_520;
              auVar63._8_4_ = fStack_518;
              auVar63._12_4_ = fStack_514;
              auVar63._16_4_ = fStack_510;
              auVar63._20_4_ = fStack_50c;
              auVar63._24_4_ = fStack_508;
              auVar63._28_4_ = fStack_504;
              uVar242 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar31._4_4_ = uVar242;
              auVar31._0_4_ = uVar242;
              auVar31._8_4_ = uVar242;
              auVar31._12_4_ = uVar242;
              auVar31._16_4_ = uVar242;
              auVar31._20_4_ = uVar242;
              auVar31._24_4_ = uVar242;
              auVar31._28_4_ = uVar242;
              uVar13 = vcmpps_avx512vl(auVar63,auVar31,2);
              bVar72 = ~('\x01' << ((byte)iVar16 & 0x1f)) & bVar72 & (byte)uVar13;
            } while (bVar72 != 0);
          }
          auVar162._0_4_ = (float)local_540._0_4_ + (float)local_660._0_4_;
          auVar162._4_4_ = (float)local_540._4_4_ + (float)local_660._4_4_;
          auVar162._8_4_ = fStack_538 + fStack_658;
          auVar162._12_4_ = fStack_534 + fStack_654;
          auVar162._16_4_ = fStack_530 + fStack_650;
          auVar162._20_4_ = fStack_52c + fStack_64c;
          auVar162._24_4_ = fStack_528 + fStack_648;
          auVar162._28_4_ = fStack_524 + fStack_644;
          uVar242 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar32._4_4_ = uVar242;
          auVar32._0_4_ = uVar242;
          auVar32._8_4_ = uVar242;
          auVar32._12_4_ = uVar242;
          auVar32._16_4_ = uVar242;
          auVar32._20_4_ = uVar242;
          auVar32._24_4_ = uVar242;
          auVar32._28_4_ = uVar242;
          uVar13 = vcmpps_avx512vl(auVar162,auVar32,2);
          bVar74 = (byte)local_8ac | (byte)local_8b4;
          bVar69 = (byte)uVar14 & bVar69 & (byte)uVar13;
          auVar163._8_4_ = 2;
          auVar163._0_8_ = 0x200000002;
          auVar163._12_4_ = 2;
          auVar163._16_4_ = 2;
          auVar163._20_4_ = 2;
          auVar163._24_4_ = 2;
          auVar163._28_4_ = 2;
          auVar33._8_4_ = 3;
          auVar33._0_8_ = 0x300000003;
          auVar33._12_4_ = 3;
          auVar33._16_4_ = 3;
          auVar33._20_4_ = 3;
          auVar33._24_4_ = 3;
          auVar33._28_4_ = 3;
          auVar96 = vpblendmd_avx512vl(auVar163,auVar33);
          local_540._0_4_ = (uint)(bVar74 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar74 & 1) * 2;
          bVar5 = (bool)(bVar74 >> 1 & 1);
          local_540._4_4_ = (uint)bVar5 * auVar96._4_4_ | (uint)!bVar5 * 2;
          bVar5 = (bool)(bVar74 >> 2 & 1);
          fStack_538 = (float)((uint)bVar5 * auVar96._8_4_ | (uint)!bVar5 * 2);
          bVar5 = (bool)(bVar74 >> 3 & 1);
          fStack_534 = (float)((uint)bVar5 * auVar96._12_4_ | (uint)!bVar5 * 2);
          bVar5 = (bool)(bVar74 >> 4 & 1);
          fStack_530 = (float)((uint)bVar5 * auVar96._16_4_ | (uint)!bVar5 * 2);
          bVar5 = (bool)(bVar74 >> 5 & 1);
          fStack_52c = (float)((uint)bVar5 * auVar96._20_4_ | (uint)!bVar5 * 2);
          bVar5 = (bool)(bVar74 >> 6 & 1);
          fStack_528 = (float)((uint)bVar5 * auVar96._24_4_ | (uint)!bVar5 * 2);
          fStack_524 = (float)((uint)(bVar74 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar74 >> 7) * 2
                              );
          uVar13 = vpcmpd_avx512vl(_local_540,local_4c0,2);
          bVar74 = (byte)uVar13 & bVar69;
          if (bVar74 != 0) {
            auVar84 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar82 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar80 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
            auVar85 = vminps_avx(auVar84,auVar80);
            auVar84 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
            auVar80 = vmaxps_avx(auVar82,auVar84);
            auVar82 = vandps_avx(auVar85,auVar222._0_16_);
            auVar84 = vandps_avx(auVar80,auVar222._0_16_);
            auVar82 = vmaxps_avx(auVar82,auVar84);
            auVar84 = vmovshdup_avx(auVar82);
            auVar84 = vmaxss_avx(auVar84,auVar82);
            auVar82 = vshufpd_avx(auVar82,auVar82,1);
            auVar82 = vmaxss_avx(auVar82,auVar84);
            fVar145 = auVar82._0_4_ * 1.9073486e-06;
            local_780 = vshufps_avx(auVar80,auVar80,0xff);
            _local_680 = _local_480;
            local_520 = (float)local_480._0_4_ + (float)local_660._0_4_;
            fStack_51c = (float)local_480._4_4_ + (float)local_660._4_4_;
            fStack_518 = fStack_478 + fStack_658;
            fStack_514 = fStack_474 + fStack_654;
            fStack_510 = fStack_470 + fStack_650;
            fStack_50c = fStack_46c + fStack_64c;
            fStack_508 = fStack_468 + fStack_648;
            fStack_504 = fStack_464 + fStack_644;
            do {
              auVar164._8_4_ = 0x7f800000;
              auVar164._0_8_ = 0x7f8000007f800000;
              auVar164._12_4_ = 0x7f800000;
              auVar164._16_4_ = 0x7f800000;
              auVar164._20_4_ = 0x7f800000;
              auVar164._24_4_ = 0x7f800000;
              auVar164._28_4_ = 0x7f800000;
              auVar96 = vblendmps_avx512vl(auVar164,_local_680);
              auVar133._0_4_ =
                   (uint)(bVar74 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar74 & 1) * 0x7f800000;
              bVar5 = (bool)(bVar74 >> 1 & 1);
              auVar133._4_4_ = (uint)bVar5 * auVar96._4_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar74 >> 2 & 1);
              auVar133._8_4_ = (uint)bVar5 * auVar96._8_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar74 >> 3 & 1);
              auVar133._12_4_ = (uint)bVar5 * auVar96._12_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar74 >> 4 & 1);
              auVar133._16_4_ = (uint)bVar5 * auVar96._16_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar74 >> 5 & 1);
              auVar133._20_4_ = (uint)bVar5 * auVar96._20_4_ | (uint)!bVar5 * 0x7f800000;
              auVar133._24_4_ =
                   (uint)(bVar74 >> 6) * auVar96._24_4_ | (uint)!(bool)(bVar74 >> 6) * 0x7f800000;
              auVar133._28_4_ = 0x7f800000;
              auVar96 = vshufps_avx(auVar133,auVar133,0xb1);
              auVar96 = vminps_avx(auVar133,auVar96);
              auVar94 = vshufpd_avx(auVar96,auVar96,5);
              auVar96 = vminps_avx(auVar96,auVar94);
              auVar94 = vpermpd_avx2(auVar96,0x4e);
              auVar96 = vminps_avx(auVar96,auVar94);
              uVar13 = vcmpps_avx512vl(auVar133,auVar96,0);
              bVar70 = (byte)uVar13 & bVar74;
              bVar72 = bVar74;
              if (bVar70 != 0) {
                bVar72 = bVar70;
              }
              iVar16 = 0;
              for (uVar79 = (uint)bVar72; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                iVar16 = iVar16 + 1;
              }
              fVar232 = *(float *)(local_500 + (uint)(iVar16 << 2));
              fVar234 = *(float *)(local_460 + (uint)(iVar16 << 2));
              fVar236 = local_8a4;
              if ((float)local_7a0._0_4_ < 0.0) {
                fVar236 = sqrtf((float)local_7a0._0_4_);
              }
              lVar76 = 4;
              do {
                auVar150._4_4_ = fVar234;
                auVar150._0_4_ = fVar234;
                auVar150._8_4_ = fVar234;
                auVar150._12_4_ = fVar234;
                auVar84 = vfmadd132ps_fma(auVar150,ZEXT816(0) << 0x40,local_790);
                fVar243 = 1.0 - fVar232;
                auVar195._0_4_ = local_6e0._0_4_ * fVar232;
                auVar195._4_4_ = local_6e0._4_4_ * fVar232;
                auVar195._8_4_ = local_6e0._8_4_ * fVar232;
                auVar195._12_4_ = local_6e0._12_4_ * fVar232;
                local_720 = ZEXT416((uint)fVar243);
                auVar210._4_4_ = fVar243;
                auVar210._0_4_ = fVar243;
                auVar210._8_4_ = fVar243;
                auVar210._12_4_ = fVar243;
                auVar82 = vfmadd231ps_fma(auVar195,auVar210,local_6a0._0_16_);
                auVar218._0_4_ = local_6c0._0_4_ * fVar232;
                auVar218._4_4_ = local_6c0._4_4_ * fVar232;
                auVar218._8_4_ = local_6c0._8_4_ * fVar232;
                auVar218._12_4_ = local_6c0._12_4_ * fVar232;
                auVar80 = vfmadd231ps_fma(auVar218,auVar210,local_6e0._0_16_);
                auVar225._0_4_ = fVar232 * (float)local_700._0_4_;
                auVar225._4_4_ = fVar232 * (float)local_700._4_4_;
                auVar225._8_4_ = fVar232 * fStack_6f8;
                auVar225._12_4_ = fVar232 * fStack_6f4;
                auVar85 = vfmadd231ps_fma(auVar225,auVar210,local_6c0._0_16_);
                auVar230._0_4_ = fVar232 * auVar80._0_4_;
                auVar230._4_4_ = fVar232 * auVar80._4_4_;
                auVar230._8_4_ = fVar232 * auVar80._8_4_;
                auVar230._12_4_ = fVar232 * auVar80._12_4_;
                auVar82 = vfmadd231ps_fma(auVar230,auVar210,auVar82);
                auVar196._0_4_ = fVar232 * auVar85._0_4_;
                auVar196._4_4_ = fVar232 * auVar85._4_4_;
                auVar196._8_4_ = fVar232 * auVar85._8_4_;
                auVar196._12_4_ = fVar232 * auVar85._12_4_;
                auVar80 = vfmadd231ps_fma(auVar196,auVar210,auVar80);
                auVar219._0_4_ = fVar232 * auVar80._0_4_;
                auVar219._4_4_ = fVar232 * auVar80._4_4_;
                auVar219._8_4_ = fVar232 * auVar80._8_4_;
                auVar219._12_4_ = fVar232 * auVar80._12_4_;
                auVar85 = vfmadd231ps_fma(auVar219,auVar82,auVar210);
                auVar82 = vsubps_avx(auVar80,auVar82);
                auVar20._8_4_ = 0x40400000;
                auVar20._0_8_ = 0x4040000040400000;
                auVar20._12_4_ = 0x40400000;
                auVar80 = vmulps_avx512vl(auVar82,auVar20);
                local_640._0_16_ = auVar85;
                auVar82 = vsubps_avx(auVar84,auVar85);
                local_7c0._0_16_ = auVar82;
                auVar82 = vdpps_avx(auVar82,auVar82,0x7f);
                local_7e0._0_16_ = auVar82;
                local_920 = ZEXT416((uint)fVar232);
                if (auVar82._0_4_ < 0.0) {
                  auVar249._0_4_ = sqrtf(auVar82._0_4_);
                  auVar249._4_60_ = extraout_var_00;
                  auVar82 = auVar249._0_16_;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar82,auVar82);
                }
                local_730 = vdpps_avx(auVar80,auVar80,0x7f);
                fVar243 = local_730._0_4_;
                auVar197._4_12_ = ZEXT812(0) << 0x20;
                auVar197._0_4_ = fVar243;
                auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar197);
                fVar166 = auVar84._0_4_;
                local_740 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar197);
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar85 = vxorps_avx512vl(local_730,auVar21);
                auVar84 = vfnmadd213ss_fma(local_740,local_730,ZEXT416(0x40000000));
                uVar79 = auVar82._0_4_;
                if (fVar243 < auVar85._0_4_) {
                  fVar238 = sqrtf(fVar243);
                  auVar82 = ZEXT416(uVar79);
                }
                else {
                  auVar85 = vsqrtss_avx(local_730,local_730);
                  fVar238 = auVar85._0_4_;
                }
                fVar243 = fVar166 * 1.5 + fVar243 * -0.5 * fVar166 * fVar166 * fVar166;
                auVar151._0_4_ = auVar80._0_4_ * fVar243;
                auVar151._4_4_ = auVar80._4_4_ * fVar243;
                auVar151._8_4_ = auVar80._8_4_ * fVar243;
                auVar151._12_4_ = auVar80._12_4_ * fVar243;
                auVar85 = vdpps_avx(local_7c0._0_16_,auVar151,0x7f);
                fVar239 = auVar82._0_4_;
                fVar166 = auVar85._0_4_;
                auVar152._0_4_ = fVar166 * fVar166;
                auVar152._4_4_ = auVar85._4_4_ * auVar85._4_4_;
                auVar152._8_4_ = auVar85._8_4_ * auVar85._8_4_;
                auVar152._12_4_ = auVar85._12_4_ * auVar85._12_4_;
                auVar86 = vsubps_avx512vl(local_7e0._0_16_,auVar152);
                fVar207 = auVar86._0_4_;
                auVar174._4_12_ = ZEXT812(0) << 0x20;
                auVar174._0_4_ = fVar207;
                auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
                auVar88 = vmulss_avx512f(auVar87,ZEXT416(0x3fc00000));
                auVar81 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
                if (fVar207 < 0.0) {
                  local_760 = fVar243;
                  fStack_75c = fVar243;
                  fStack_758 = fVar243;
                  fStack_754 = fVar243;
                  local_750 = auVar87;
                  fVar207 = sqrtf(fVar207);
                  auVar81 = ZEXT416(auVar81._0_4_);
                  auVar88 = ZEXT416(auVar88._0_4_);
                  auVar82 = ZEXT416(uVar79);
                  auVar87 = local_750;
                  fVar243 = local_760;
                  fVar233 = fStack_75c;
                  fVar235 = fStack_758;
                  fVar237 = fStack_754;
                }
                else {
                  auVar86 = vsqrtss_avx(auVar86,auVar86);
                  fVar207 = auVar86._0_4_;
                  fVar233 = fVar243;
                  fVar235 = fVar243;
                  fVar237 = fVar243;
                }
                auVar250 = ZEXT3264(local_880);
                auVar251 = ZEXT3264(local_8a0);
                auVar249 = ZEXT3264(local_800);
                auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_920,local_720);
                fVar167 = auVar86._0_4_ * 6.0;
                fVar12 = fVar232 * 6.0;
                auVar198._0_4_ = fVar12 * (float)local_700._0_4_;
                auVar198._4_4_ = fVar12 * (float)local_700._4_4_;
                auVar198._8_4_ = fVar12 * fStack_6f8;
                auVar198._12_4_ = fVar12 * fStack_6f4;
                auVar175._4_4_ = fVar167;
                auVar175._0_4_ = fVar167;
                auVar175._8_4_ = fVar167;
                auVar175._12_4_ = fVar167;
                auVar86 = vfmadd132ps_fma(auVar175,auVar198,local_6c0._0_16_);
                auVar248 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_720,local_920);
                fVar167 = auVar248._0_4_ * 6.0;
                auVar199._4_4_ = fVar167;
                auVar199._0_4_ = fVar167;
                auVar199._8_4_ = fVar167;
                auVar199._12_4_ = fVar167;
                auVar86 = vfmadd132ps_fma(auVar199,auVar86,local_6e0._0_16_);
                fVar167 = local_720._0_4_ * 6.0;
                auVar176._4_4_ = fVar167;
                auVar176._0_4_ = fVar167;
                auVar176._8_4_ = fVar167;
                auVar176._12_4_ = fVar167;
                auVar86 = vfmadd132ps_fma(auVar176,auVar86,local_6a0._0_16_);
                auVar200._0_4_ = auVar86._0_4_ * (float)local_730._0_4_;
                auVar200._4_4_ = auVar86._4_4_ * (float)local_730._0_4_;
                auVar200._8_4_ = auVar86._8_4_ * (float)local_730._0_4_;
                auVar200._12_4_ = auVar86._12_4_ * (float)local_730._0_4_;
                auVar86 = vdpps_avx(auVar80,auVar86,0x7f);
                fVar167 = auVar86._0_4_;
                auVar177._0_4_ = auVar80._0_4_ * fVar167;
                auVar177._4_4_ = auVar80._4_4_ * fVar167;
                auVar177._8_4_ = auVar80._8_4_ * fVar167;
                auVar177._12_4_ = auVar80._12_4_ * fVar167;
                auVar86 = vsubps_avx(auVar200,auVar177);
                fVar167 = auVar84._0_4_ * (float)local_740._0_4_;
                auVar22._8_4_ = 0x80000000;
                auVar22._0_8_ = 0x8000000080000000;
                auVar22._12_4_ = 0x80000000;
                auVar135._16_16_ = local_800._16_16_;
                auVar89 = vxorps_avx512vl(auVar80,auVar22);
                auVar220._0_4_ = fVar243 * auVar86._0_4_ * fVar167;
                auVar220._4_4_ = fVar233 * auVar86._4_4_ * fVar167;
                auVar220._8_4_ = fVar235 * auVar86._8_4_ * fVar167;
                auVar220._12_4_ = fVar237 * auVar86._12_4_ * fVar167;
                auVar84 = vdpps_avx(auVar89,auVar151,0x7f);
                auVar248 = vmaxss_avx(ZEXT416((uint)fVar145),
                                      ZEXT416((uint)(fVar234 * fVar236 * 1.9073486e-06)));
                auVar86 = vdpps_avx(local_7c0._0_16_,auVar220,0x7f);
                auVar82 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar145),auVar248);
                auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar239 + 1.0)),
                                          ZEXT416((uint)(fVar145 / fVar238)),auVar82);
                auVar82 = vdpps_avx(local_790,auVar151,0x7f);
                fVar243 = auVar84._0_4_ + auVar86._0_4_;
                auVar84 = vdpps_avx(local_7c0._0_16_,auVar89,0x7f);
                auVar86 = vmulss_avx512f(auVar81,auVar87);
                auVar81 = vmulss_avx512f(auVar87,auVar87);
                auVar87 = vdpps_avx(local_7c0._0_16_,local_790,0x7f);
                auVar81 = vaddss_avx512f(auVar88,ZEXT416((uint)(auVar86._0_4_ * auVar81._0_4_)));
                auVar86 = vfnmadd231ss_fma(auVar84,auVar85,ZEXT416((uint)fVar243));
                auVar88 = vfnmadd231ss_fma(auVar87,auVar85,auVar82);
                auVar84 = vpermilps_avx(local_640._0_16_,0xff);
                fVar207 = fVar207 - auVar84._0_4_;
                auVar84 = vshufps_avx(auVar80,auVar80,0xff);
                auVar87 = vfmsub213ss_fma(auVar86,auVar81,auVar84);
                fVar238 = auVar88._0_4_ * auVar81._0_4_;
                auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar87._0_4_)),
                                          ZEXT416((uint)fVar243),ZEXT416((uint)fVar238));
                fVar239 = auVar86._0_4_;
                fVar232 = fVar232 - (fVar166 * (fVar238 / fVar239) -
                                    fVar207 * (auVar82._0_4_ / fVar239));
                fVar234 = fVar234 - (fVar207 * (fVar243 / fVar239) -
                                    fVar166 * (auVar87._0_4_ / fVar239));
                auVar221._8_4_ = 0x7fffffff;
                auVar221._0_8_ = 0x7fffffff7fffffff;
                auVar221._12_4_ = 0x7fffffff;
                auVar222 = ZEXT1664(auVar221);
                auVar82 = vandps_avx(auVar85,auVar221);
                if (auVar83._0_4_ <= auVar82._0_4_) {
LAB_01d75ad5:
                  bVar5 = false;
                }
                else {
                  auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ + auVar248._0_4_)),
                                            local_780,ZEXT416(0x36000000));
                  auVar82 = vandps_avx(ZEXT416((uint)fVar207),auVar221);
                  if (auVar85._0_4_ <= auVar82._0_4_) goto LAB_01d75ad5;
                  fVar234 = fVar234 + (float)local_770._0_4_;
                  bVar5 = true;
                  if (fVar208 <= fVar234) {
                    fVar243 = *(float *)(ray + k * 4 + 0x80);
                    auVar222 = ZEXT464((uint)fVar243);
                    if (((fVar234 <= fVar243) && (0.0 <= fVar232)) && (fVar232 <= 1.0)) {
                      auVar135._0_16_ = ZEXT816(0) << 0x20;
                      auVar134._4_28_ = auVar135._4_28_;
                      auVar134._0_4_ = local_7e0._0_4_;
                      auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar134._0_16_);
                      fVar166 = auVar82._0_4_;
                      auVar82 = vmulss_avx512f(local_7e0._0_16_,ZEXT416(0xbf000000));
                      pGVar3 = (context->scene->geometries).items[uVar75].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        fVar166 = fVar166 * 1.5 + auVar82._0_4_ * fVar166 * fVar166 * fVar166;
                        auVar178._0_4_ = local_7c0._0_4_ * fVar166;
                        auVar178._4_4_ = local_7c0._4_4_ * fVar166;
                        auVar178._8_4_ = local_7c0._8_4_ * fVar166;
                        auVar178._12_4_ = local_7c0._12_4_ * fVar166;
                        auVar85 = vfmadd213ps_fma(auVar84,auVar178,auVar80);
                        auVar82 = vshufps_avx(auVar178,auVar178,0xc9);
                        auVar84 = vshufps_avx(auVar80,auVar80,0xc9);
                        auVar179._0_4_ = auVar178._0_4_ * auVar84._0_4_;
                        auVar179._4_4_ = auVar178._4_4_ * auVar84._4_4_;
                        auVar179._8_4_ = auVar178._8_4_ * auVar84._8_4_;
                        auVar179._12_4_ = auVar178._12_4_ * auVar84._12_4_;
                        auVar80 = vfmsub231ps_fma(auVar179,auVar80,auVar82);
                        auVar82 = vshufps_avx(auVar80,auVar80,0xc9);
                        auVar84 = vshufps_avx(auVar85,auVar85,0xc9);
                        auVar80 = vshufps_avx(auVar80,auVar80,0xd2);
                        auVar153._0_4_ = auVar85._0_4_ * auVar80._0_4_;
                        auVar153._4_4_ = auVar85._4_4_ * auVar80._4_4_;
                        auVar153._8_4_ = auVar85._8_4_ * auVar80._8_4_;
                        auVar153._12_4_ = auVar85._12_4_ * auVar80._12_4_;
                        auVar82 = vfmsub231ps_fma(auVar153,auVar82,auVar84);
                        uVar242 = auVar82._0_4_;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar234;
                          uVar2 = vextractps_avx(auVar82,1);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                          uVar2 = vextractps_avx(auVar82,2);
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                          *(undefined4 *)(ray + k * 4 + 0xe0) = uVar242;
                          *(float *)(ray + k * 4 + 0xf0) = fVar232;
                          *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                          *(int *)(ray + k * 4 + 0x110) = (int)local_808;
                          *(uint *)(ray + k * 4 + 0x120) = uVar75;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          local_5e0 = (RTCHitN  [16])vshufps_avx(auVar82,auVar82,0x55);
                          auStack_5d0 = vshufps_avx(auVar82,auVar82,0xaa);
                          local_5c0 = uVar242;
                          uStack_5bc = uVar242;
                          uStack_5b8 = uVar242;
                          uStack_5b4 = uVar242;
                          local_5b0 = fVar232;
                          fStack_5ac = fVar232;
                          fStack_5a8 = fVar232;
                          fStack_5a4 = fVar232;
                          local_5a0 = ZEXT416(0) << 0x20;
                          local_590 = local_600._0_8_;
                          uStack_588 = local_600._8_8_;
                          local_580 = local_5f0;
                          vpcmpeqd_avx2(ZEXT1632(local_5f0),ZEXT1632(local_5f0));
                          uStack_56c = context->user->instID[0];
                          local_570 = uStack_56c;
                          uStack_568 = uStack_56c;
                          uStack_564 = uStack_56c;
                          uStack_560 = context->user->instPrimID[0];
                          uStack_55c = uStack_560;
                          uStack_558 = uStack_560;
                          uStack_554 = uStack_560;
                          *(float *)(ray + k * 4 + 0x80) = fVar234;
                          local_8d0 = local_610._0_8_;
                          uStack_8c8 = local_610._8_8_;
                          local_860.valid = (int *)&local_8d0;
                          local_860.geometryUserPtr = pGVar3->userPtr;
                          local_860.context = context->user;
                          local_860.hit = local_5e0;
                          local_860.N = 4;
                          local_860.ray = (RTCRayN *)ray;
                          if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar3->intersectionFilterN)(&local_860);
                            auVar249 = ZEXT3264(local_800);
                            auVar251 = ZEXT3264(local_8a0);
                            auVar250 = ZEXT3264(local_880);
                          }
                          auVar61._8_8_ = uStack_8c8;
                          auVar61._0_8_ = local_8d0;
                          uVar78 = vptestmd_avx512vl(auVar61,auVar61);
                          if ((uVar78 & 0xf) == 0) {
LAB_01d75d70:
                            *(float *)(ray + k * 4 + 0x80) = fVar243;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var4)(&local_860);
                              auVar249 = ZEXT3264(local_800);
                              auVar251 = ZEXT3264(local_8a0);
                              auVar250 = ZEXT3264(local_880);
                            }
                            auVar62._8_8_ = uStack_8c8;
                            auVar62._0_8_ = local_8d0;
                            uVar78 = vptestmd_avx512vl(auVar62,auVar62);
                            uVar78 = uVar78 & 0xf;
                            bVar72 = (byte)uVar78;
                            if (bVar72 == 0) goto LAB_01d75d70;
                            iVar56 = *(int *)(local_860.hit + 4);
                            iVar57 = *(int *)(local_860.hit + 8);
                            iVar58 = *(int *)(local_860.hit + 0xc);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar7 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_860.ray + 0xc0) =
                                 (uint)(bVar72 & 1) * *(int *)local_860.hit |
                                 (uint)!(bool)(bVar72 & 1) * *(int *)(local_860.ray + 0xc0);
                            *(uint *)(local_860.ray + 0xc4) =
                                 (uint)bVar77 * iVar56 |
                                 (uint)!bVar77 * *(int *)(local_860.ray + 0xc4);
                            *(uint *)(local_860.ray + 200) =
                                 (uint)bVar6 * iVar57 | (uint)!bVar6 * *(int *)(local_860.ray + 200)
                            ;
                            *(uint *)(local_860.ray + 0xcc) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0xcc);
                            iVar56 = *(int *)(local_860.hit + 0x14);
                            iVar57 = *(int *)(local_860.hit + 0x18);
                            iVar58 = *(int *)(local_860.hit + 0x1c);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar7 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_860.ray + 0xd0) =
                                 (uint)(bVar72 & 1) * *(int *)(local_860.hit + 0x10) |
                                 (uint)!(bool)(bVar72 & 1) * *(int *)(local_860.ray + 0xd0);
                            *(uint *)(local_860.ray + 0xd4) =
                                 (uint)bVar77 * iVar56 |
                                 (uint)!bVar77 * *(int *)(local_860.ray + 0xd4);
                            *(uint *)(local_860.ray + 0xd8) =
                                 (uint)bVar6 * iVar57 |
                                 (uint)!bVar6 * *(int *)(local_860.ray + 0xd8);
                            *(uint *)(local_860.ray + 0xdc) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0xdc);
                            iVar56 = *(int *)(local_860.hit + 0x24);
                            iVar57 = *(int *)(local_860.hit + 0x28);
                            iVar58 = *(int *)(local_860.hit + 0x2c);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar7 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_860.ray + 0xe0) =
                                 (uint)(bVar72 & 1) * *(int *)(local_860.hit + 0x20) |
                                 (uint)!(bool)(bVar72 & 1) * *(int *)(local_860.ray + 0xe0);
                            *(uint *)(local_860.ray + 0xe4) =
                                 (uint)bVar77 * iVar56 |
                                 (uint)!bVar77 * *(int *)(local_860.ray + 0xe4);
                            *(uint *)(local_860.ray + 0xe8) =
                                 (uint)bVar6 * iVar57 |
                                 (uint)!bVar6 * *(int *)(local_860.ray + 0xe8);
                            *(uint *)(local_860.ray + 0xec) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0xec);
                            iVar56 = *(int *)(local_860.hit + 0x34);
                            iVar57 = *(int *)(local_860.hit + 0x38);
                            iVar58 = *(int *)(local_860.hit + 0x3c);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar7 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_860.ray + 0xf0) =
                                 (uint)(bVar72 & 1) * *(int *)(local_860.hit + 0x30) |
                                 (uint)!(bool)(bVar72 & 1) * *(int *)(local_860.ray + 0xf0);
                            *(uint *)(local_860.ray + 0xf4) =
                                 (uint)bVar77 * iVar56 |
                                 (uint)!bVar77 * *(int *)(local_860.ray + 0xf4);
                            *(uint *)(local_860.ray + 0xf8) =
                                 (uint)bVar6 * iVar57 |
                                 (uint)!bVar6 * *(int *)(local_860.ray + 0xf8);
                            *(uint *)(local_860.ray + 0xfc) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0xfc);
                            auVar90._0_4_ =
                                 (uint)(bVar72 & 1) * *(int *)(local_860.hit + 0x40) |
                                 (uint)!(bool)(bVar72 & 1) * *(int *)(local_860.ray + 0x100);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            auVar90._4_4_ =
                                 (uint)bVar77 * *(int *)(local_860.hit + 0x44) |
                                 (uint)!bVar77 * *(int *)(local_860.ray + 0x104);
                            bVar77 = (bool)((byte)(uVar78 >> 2) & 1);
                            auVar90._8_4_ =
                                 (uint)bVar77 * *(int *)(local_860.hit + 0x48) |
                                 (uint)!bVar77 * *(int *)(local_860.ray + 0x108);
                            bVar77 = SUB81(uVar78 >> 3,0);
                            auVar90._12_4_ =
                                 (uint)bVar77 * *(int *)(local_860.hit + 0x4c) |
                                 (uint)!bVar77 * *(int *)(local_860.ray + 0x10c);
                            *(undefined1 (*) [16])(local_860.ray + 0x100) = auVar90;
                            auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x50));
                            *(undefined1 (*) [16])(local_860.ray + 0x110) = auVar82;
                            auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x60));
                            *(undefined1 (*) [16])(local_860.ray + 0x120) = auVar82;
                            auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x70));
                            *(undefined1 (*) [16])(local_860.ray + 0x130) = auVar82;
                            auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x80));
                            *(undefined1 (*) [16])(local_860.ray + 0x140) = auVar82;
                          }
                          auVar222 = ZEXT464((uint)fVar243);
                        }
                      }
                    }
                  }
                }
                bVar77 = lVar76 != 0;
                lVar76 = lVar76 + -1;
              } while ((!bVar5) && (bVar77));
              auVar64._4_4_ = fStack_51c;
              auVar64._0_4_ = local_520;
              auVar64._8_4_ = fStack_518;
              auVar64._12_4_ = fStack_514;
              auVar64._16_4_ = fStack_510;
              auVar64._20_4_ = fStack_50c;
              auVar64._24_4_ = fStack_508;
              auVar64._28_4_ = fStack_504;
              uVar242 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar34._4_4_ = uVar242;
              auVar34._0_4_ = uVar242;
              auVar34._8_4_ = uVar242;
              auVar34._12_4_ = uVar242;
              auVar34._16_4_ = uVar242;
              auVar34._20_4_ = uVar242;
              auVar34._24_4_ = uVar242;
              auVar34._28_4_ = uVar242;
              uVar13 = vcmpps_avx512vl(auVar64,auVar34,2);
              bVar74 = ~('\x01' << ((byte)iVar16 & 0x1f)) & bVar74 & (byte)uVar13;
            } while (bVar74 != 0);
          }
          uVar14 = vpcmpd_avx512vl(local_4c0,_local_540,1);
          uVar15 = vpcmpd_avx512vl(local_4c0,local_440,1);
          auVar184._0_4_ = (float)local_660._0_4_ + (float)local_1c0._0_4_;
          auVar184._4_4_ = (float)local_660._4_4_ + (float)local_1c0._4_4_;
          auVar184._8_4_ = fStack_658 + fStack_1b8;
          auVar184._12_4_ = fStack_654 + fStack_1b4;
          auVar184._16_4_ = fStack_650 + fStack_1b0;
          auVar184._20_4_ = fStack_64c + fStack_1ac;
          auVar184._24_4_ = fStack_648 + fStack_1a8;
          auVar184._28_4_ = fStack_644 + fStack_1a4;
          uVar242 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar204._4_4_ = uVar242;
          auVar204._0_4_ = uVar242;
          auVar204._8_4_ = uVar242;
          auVar204._12_4_ = uVar242;
          auVar204._16_4_ = uVar242;
          auVar204._20_4_ = uVar242;
          auVar204._24_4_ = uVar242;
          auVar204._28_4_ = uVar242;
          uVar13 = vcmpps_avx512vl(auVar184,auVar204,2);
          bVar74 = (byte)local_8b0 & (byte)uVar15 & (byte)uVar13;
          auVar211._0_4_ = (float)local_660._0_4_ + (float)local_480._0_4_;
          auVar211._4_4_ = (float)local_660._4_4_ + (float)local_480._4_4_;
          auVar211._8_4_ = fStack_658 + fStack_478;
          auVar211._12_4_ = fStack_654 + fStack_474;
          auVar211._16_4_ = fStack_650 + fStack_470;
          auVar211._20_4_ = fStack_64c + fStack_46c;
          auVar211._24_4_ = fStack_648 + fStack_468;
          auVar211._28_4_ = fStack_644 + fStack_464;
          uVar13 = vcmpps_avx512vl(auVar211,auVar204,2);
          bVar69 = bVar69 & (byte)uVar14 & (byte)uVar13 | bVar74;
          prim = local_820;
          if (bVar69 == 0) {
            auVar212 = ZEXT3264(_DAT_02020f20);
          }
          else {
            uVar78 = local_818 & 0xffffffff;
            abStack_180[uVar78 * 0x60] = bVar69;
            auVar136._0_4_ =
                 (uint)(bVar74 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar74 & 1) * local_480._0_4_;
            bVar5 = (bool)(bVar74 >> 1 & 1);
            auVar136._4_4_ = (uint)bVar5 * local_1c0._4_4_ | (uint)!bVar5 * local_480._4_4_;
            bVar5 = (bool)(bVar74 >> 2 & 1);
            auVar136._8_4_ = (uint)bVar5 * (int)fStack_1b8 | (uint)!bVar5 * (int)fStack_478;
            bVar5 = (bool)(bVar74 >> 3 & 1);
            auVar136._12_4_ = (uint)bVar5 * (int)fStack_1b4 | (uint)!bVar5 * (int)fStack_474;
            bVar5 = (bool)(bVar74 >> 4 & 1);
            auVar136._16_4_ = (uint)bVar5 * (int)fStack_1b0 | (uint)!bVar5 * (int)fStack_470;
            bVar5 = (bool)(bVar74 >> 5 & 1);
            auVar136._20_4_ = (uint)bVar5 * (int)fStack_1ac | (uint)!bVar5 * (int)fStack_46c;
            bVar5 = (bool)(bVar74 >> 6 & 1);
            auVar136._24_4_ = (uint)bVar5 * (int)fStack_1a8 | (uint)!bVar5 * (int)fStack_468;
            auVar136._28_4_ =
                 (uint)(bVar74 >> 7) * (int)fStack_1a4 |
                 (uint)!(bool)(bVar74 >> 7) * (int)fStack_464;
            *(undefined1 (*) [32])(auStack_160 + uVar78 * 0x60) = auVar136;
            uVar13 = vmovlps_avx(local_830);
            *(undefined8 *)(afStack_140 + uVar78 * 0x18) = uVar13;
            auStack_138[uVar78 * 0x18] = (int)local_708 + 1;
            local_818 = (ulong)((int)local_818 + 1);
            auVar212 = ZEXT3264(_DAT_02020f20);
          }
        }
      }
    }
    auVar205 = ZEXT1664(local_830);
    local_818 = local_818 & 0xffffffff;
    do {
      if ((int)local_818 == 0) {
        uVar242 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar36._4_4_ = uVar242;
        auVar36._0_4_ = uVar242;
        auVar36._8_4_ = uVar242;
        auVar36._12_4_ = uVar242;
        auVar36._16_4_ = uVar242;
        auVar36._20_4_ = uVar242;
        auVar36._24_4_ = uVar242;
        auVar36._28_4_ = uVar242;
        uVar13 = vcmpps_avx512vl(local_420,auVar36,2);
        uVar75 = (uint)uVar13 & (uint)local_810 - 1 & (uint)local_810;
        local_810 = (ulong)uVar75;
        if (uVar75 == 0) {
          return;
        }
        goto LAB_01d739de;
      }
      uVar78 = (ulong)((int)local_818 - 1);
      lVar76 = uVar78 * 0x60;
      auVar96 = *(undefined1 (*) [32])(auStack_160 + lVar76);
      auVar185._0_4_ = auVar96._0_4_ + (float)local_660._0_4_;
      auVar185._4_4_ = auVar96._4_4_ + (float)local_660._4_4_;
      auVar185._8_4_ = auVar96._8_4_ + fStack_658;
      auVar185._12_4_ = auVar96._12_4_ + fStack_654;
      auVar185._16_4_ = auVar96._16_4_ + fStack_650;
      auVar185._20_4_ = auVar96._20_4_ + fStack_64c;
      auVar185._24_4_ = auVar96._24_4_ + fStack_648;
      auVar185._28_4_ = auVar96._28_4_ + fStack_644;
      uVar242 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar35._4_4_ = uVar242;
      auVar35._0_4_ = uVar242;
      auVar35._8_4_ = uVar242;
      auVar35._12_4_ = uVar242;
      auVar35._16_4_ = uVar242;
      auVar35._20_4_ = uVar242;
      auVar35._24_4_ = uVar242;
      auVar35._28_4_ = uVar242;
      uVar13 = vcmpps_avx512vl(auVar185,auVar35,2);
      uVar79 = (uint)uVar13 & (uint)abStack_180[lVar76];
      bVar69 = (byte)uVar79;
      if (uVar79 != 0) {
        auVar186._8_4_ = 0x7f800000;
        auVar186._0_8_ = 0x7f8000007f800000;
        auVar186._12_4_ = 0x7f800000;
        auVar186._16_4_ = 0x7f800000;
        auVar186._20_4_ = 0x7f800000;
        auVar186._24_4_ = 0x7f800000;
        auVar186._28_4_ = 0x7f800000;
        auVar94 = vblendmps_avx512vl(auVar186,auVar96);
        auVar137._0_4_ =
             (uint)(bVar69 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar69 & 1) * (int)auVar96._0_4_;
        bVar5 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar137._4_4_ = (uint)bVar5 * auVar94._4_4_ | (uint)!bVar5 * (int)auVar96._4_4_;
        bVar5 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar137._8_4_ = (uint)bVar5 * auVar94._8_4_ | (uint)!bVar5 * (int)auVar96._8_4_;
        bVar5 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar137._12_4_ = (uint)bVar5 * auVar94._12_4_ | (uint)!bVar5 * (int)auVar96._12_4_;
        bVar5 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar137._16_4_ = (uint)bVar5 * auVar94._16_4_ | (uint)!bVar5 * (int)auVar96._16_4_;
        bVar5 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar137._20_4_ = (uint)bVar5 * auVar94._20_4_ | (uint)!bVar5 * (int)auVar96._20_4_;
        bVar5 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar137._24_4_ = (uint)bVar5 * auVar94._24_4_ | (uint)!bVar5 * (int)auVar96._24_4_;
        auVar137._28_4_ =
             (uVar79 >> 7) * auVar94._28_4_ | (uint)!SUB41(uVar79 >> 7,0) * (int)auVar96._28_4_;
        auVar96 = vshufps_avx(auVar137,auVar137,0xb1);
        auVar96 = vminps_avx(auVar137,auVar96);
        auVar94 = vshufpd_avx(auVar96,auVar96,5);
        auVar96 = vminps_avx(auVar96,auVar94);
        auVar94 = vpermpd_avx2(auVar96,0x4e);
        auVar96 = vminps_avx(auVar96,auVar94);
        uVar13 = vcmpps_avx512vl(auVar137,auVar96,0);
        bVar74 = (byte)uVar13 & bVar69;
        if (bVar74 != 0) {
          uVar79 = (uint)bVar74;
        }
        fVar145 = afStack_140[uVar78 * 0x18 + 1];
        uVar138 = 0;
        for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
          uVar138 = uVar138 + 1;
        }
        local_708 = (ulong)auStack_138[uVar78 * 0x18];
        bVar74 = ~('\x01' << ((byte)uVar138 & 0x1f)) & bVar69;
        abStack_180[lVar76] = bVar74;
        uVar71 = uVar78;
        if (bVar74 != 0) {
          uVar71 = local_818;
        }
        fVar232 = afStack_140[uVar78 * 0x18];
        auVar187._4_4_ = fVar232;
        auVar187._0_4_ = fVar232;
        auVar187._8_4_ = fVar232;
        auVar187._12_4_ = fVar232;
        auVar187._16_4_ = fVar232;
        auVar187._20_4_ = fVar232;
        auVar187._24_4_ = fVar232;
        auVar187._28_4_ = fVar232;
        fVar145 = fVar145 - fVar232;
        auVar165._4_4_ = fVar145;
        auVar165._0_4_ = fVar145;
        auVar165._8_4_ = fVar145;
        auVar165._12_4_ = fVar145;
        auVar165._16_4_ = fVar145;
        auVar165._20_4_ = fVar145;
        auVar165._24_4_ = fVar145;
        auVar165._28_4_ = fVar145;
        auVar82 = vfmadd132ps_fma(auVar165,auVar187,auVar212._0_32_);
        _local_5e0 = ZEXT1632(auVar82);
        auVar205 = ZEXT864(*(ulong *)(local_5e0 + (ulong)uVar138 * 4));
        uVar78 = uVar71;
      }
      local_818 = uVar78;
    } while (bVar69 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }